

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct_x86_avx512::forward
          (InnerProduct_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  uint uVar3;
  _func_int *p_Var4;
  int *piVar5;
  long lVar6;
  void *pvVar7;
  size_t sVar8;
  float *pfVar9;
  void *pvVar10;
  bool bVar11;
  byte bVar12;
  ulong uVar13;
  ulong uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [64];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  float afVar69 [16];
  float afVar70 [16];
  float afVar71 [16];
  float afVar72 [16];
  float afVar73 [16];
  float afVar74 [16];
  float afVar75 [16];
  float afVar76 [16];
  float afVar77 [16];
  float afVar78 [16];
  float afVar79 [16];
  float afVar80 [16];
  int iVar81;
  uint uVar82;
  ulong uVar83;
  undefined1 (*pauVar84) [32];
  undefined1 (*pauVar85) [64];
  long lVar86;
  undefined1 (*pauVar87) [32];
  int iVar88;
  long lVar89;
  long lVar90;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  long lVar91;
  int iVar92;
  undefined1 (*pauVar93) [32];
  long lVar94;
  long lVar95;
  long lVar96;
  long lVar97;
  ulong uVar98;
  long lVar99;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar100 [16];
  undefined1 auVar170 [64];
  undefined1 auVar171 [64];
  undefined1 auVar172 [64];
  undefined1 auVar173 [64];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  undefined1 auVar176 [64];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  float fVar181;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  float fVar202;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  v4sf one;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar219;
  __m128 pos;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 in_ZMM16 [64];
  undefined1 auVar247 [64];
  undefined1 in_ZMM17 [64];
  undefined1 auVar248 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar249 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar250 [64];
  long local_150;
  int local_140;
  long local_120;
  undefined1 (*local_c8) [32];
  int *piStack_c0;
  size_t local_b8;
  int local_b0;
  Allocator *local_a8;
  int local_a0;
  int local_9c;
  undefined8 local_98;
  int local_90;
  size_t local_88;
  ulong local_80;
  Option opt_flatten;
  undefined1 auVar163 [32];
  
  auVar100 = in_ZMM30._0_16_;
  if ((opt->use_int8_inference == true) &&
     (*(int *)(&this->field_0xdc + (long)this->_vptr_InnerProduct_x86_avx512[-3]) != 0)) {
    iVar81 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar81;
  }
  iVar81 = cpu_support_x86_f16c();
  if ((iVar81 != 0) && (opt->use_fp16_storage == true)) {
    iVar81 = forward_fp16s(this,bottom_blob,top_blob,opt);
    return iVar81;
  }
  local_a0 = bottom_blob->dims;
  if (local_a0 == 2) {
    local_9c = bottom_blob->w;
    if (local_9c ==
        *(int *)(&this->field_0xd8 + (long)this->_vptr_InnerProduct_x86_avx512[-3]) /
        *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx512[-3])) {
      Mat::create(top_blob,*(int *)(&this->field_0xd0 +
                                   (long)this->_vptr_InnerProduct_x86_avx512[-3]),bottom_blob->h,
                  bottom_blob->elemsize,bottom_blob->elempack,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      p_Var4 = this->_vptr_InnerProduct_x86_avx512[-3];
      innerproduct_gemm_sse
                (bottom_blob,top_blob,&this->weight_data_tm,
                 (Mat *)(&this->field_0x178 + (long)p_Var4),
                 *(int *)(&this->field_0xe0 + (long)p_Var4),
                 (Mat *)(&this->field_0xe8 + (long)p_Var4),opt);
      return 0;
    }
  }
  else {
    local_9c = bottom_blob->w;
  }
  piVar5 = bottom_blob->refcount;
  local_c8 = (undefined1 (*) [32])bottom_blob->data;
  piStack_c0 = bottom_blob->refcount;
  local_b8 = bottom_blob->elemsize;
  local_b0 = bottom_blob->elempack;
  local_a8 = bottom_blob->allocator;
  local_98._0_4_ = bottom_blob->h;
  local_98._4_4_ = bottom_blob->d;
  local_90 = bottom_blob->c;
  local_88 = bottom_blob->cstep;
  iVar81 = local_a0;
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + 1;
    UNLOCK();
    iVar81 = bottom_blob->dims;
  }
  if (iVar81 != 1) {
    opt_flatten._16_48_ = SUB6448(*opt,0x10);
    opt_flatten._0_8_ = SUB648(*opt,0);
    opt_flatten.blob_allocator = opt->workspace_allocator;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_c8);
  }
  uVar3 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx512[-3]);
  if (opt->use_packing_layout == true) {
    if ((uVar3 & 0xf) == 0) {
      uVar82 = 0x10;
    }
    else if ((uVar3 & 7) == 0) {
      uVar82 = 8;
    }
    else {
      uVar82 = (uint)((uVar3 & 3) == 0) * 3 + 1;
    }
  }
  else {
    uVar82 = 1;
  }
  Mat::create(top_blob,(int)uVar3 / (int)uVar82,(ulong)uVar82 * (local_b8 / (ulong)(long)local_b0),
              uVar82,opt->blob_allocator);
  pauVar93 = local_c8;
  afVar80 = _ps512_cephes_log_q2;
  afVar79 = _ps512_cephes_log_q1;
  afVar78 = _ps512_cephes_exp_p5;
  afVar77 = _ps512_cephes_exp_p4;
  afVar76 = _ps512_cephes_exp_p3;
  afVar75 = _ps512_cephes_exp_p2;
  afVar74 = _ps512_cephes_exp_p1;
  afVar73 = _ps512_cephes_exp_p0;
  afVar72 = _ps512_cephes_LOG2EF;
  afVar71 = _ps512_exp_lo;
  afVar70 = _ps512_exp_hi;
  afVar69 = _ps512_1;
  local_140 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    p_Var4 = this->_vptr_InnerProduct_x86_avx512[-3];
    iVar81 = *(int *)(&this->field_0xe0 + (long)p_Var4);
    iVar88 = local_b0 * local_9c;
    iVar92 = top_blob->elempack;
    uVar3 = top_blob->w;
    uVar98 = (ulong)uVar3;
    lVar6 = *(long *)(&this->field_0x178 + (long)p_Var4);
    if (iVar92 == 1) {
      uVar98 = 0;
      local_80 = (ulong)(uint)((int)uVar3 >> 3);
      if ((int)uVar3 >> 3 < 1) {
        local_80 = uVar98;
      }
      lVar94 = (long)iVar88;
      lVar91 = lVar94 * 0x20;
      lVar89 = lVar94 * 4;
      lVar90 = lVar94 * 8;
      lVar95 = lVar94 * 0xc;
      lVar96 = lVar94 << 4;
      lVar99 = lVar94 * 0x14;
      local_120 = lVar94 * 0x18;
      local_150 = lVar94 * 0x1c;
      auVar136 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar137 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar142._8_4_ = 0x3f000000;
      auVar142._0_8_ = 0x3f0000003f000000;
      auVar142._12_4_ = 0x3f000000;
      auVar142._16_4_ = 0x3f000000;
      auVar142._20_4_ = 0x3f000000;
      auVar142._24_4_ = 0x3f000000;
      auVar142._28_4_ = 0x3f000000;
      auVar138 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
      auVar170 = ZEXT3264(auVar138);
      auVar143._8_4_ = 0x3f800000;
      auVar143._0_8_ = 0x3f8000003f800000;
      auVar143._12_4_ = 0x3f800000;
      auVar143._16_4_ = 0x3f800000;
      auVar143._20_4_ = 0x3f800000;
      auVar143._24_4_ = 0x3f800000;
      auVar143._28_4_ = 0x3f800000;
      auVar144._8_4_ = 0x3f318000;
      auVar144._0_8_ = 0x3f3180003f318000;
      auVar144._12_4_ = 0x3f318000;
      auVar144._16_4_ = 0x3f318000;
      auVar144._20_4_ = 0x3f318000;
      auVar144._24_4_ = 0x3f318000;
      auVar144._28_4_ = 0x3f318000;
      auVar145._8_4_ = 0x39506967;
      auVar145._0_8_ = 0x3950696739506967;
      auVar145._12_4_ = 0x39506967;
      auVar145._16_4_ = 0x39506967;
      auVar145._20_4_ = 0x39506967;
      auVar145._24_4_ = 0x39506967;
      auVar145._28_4_ = 0x39506967;
      auVar139 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
      auVar171 = ZEXT3264(auVar139);
      auVar140 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
      auVar173 = ZEXT3264(auVar140);
      auVar141 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
      auVar233._8_4_ = 0x3e2aaaaa;
      auVar233._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar233._12_4_ = 0x3e2aaaaa;
      auVar233._16_4_ = 0x3e2aaaaa;
      auVar233._20_4_ = 0x3e2aaaaa;
      auVar233._24_4_ = 0x3e2aaaaa;
      auVar233._28_4_ = 0x3e2aaaaa;
      auVar237._8_4_ = 0x3f800000;
      auVar237._0_8_ = 0x3f8000003f800000;
      auVar237._12_4_ = 0x3f800000;
      auVar237._16_4_ = 0x3f800000;
      auVar237._20_4_ = 0x3f800000;
      auVar237._24_4_ = 0x3f800000;
      auVar237._28_4_ = 0x3f800000;
      auVar241._8_4_ = 0xb95e8083;
      auVar241._0_8_ = 0xb95e8083b95e8083;
      auVar241._12_4_ = 0xb95e8083;
      auVar241._16_4_ = 0xb95e8083;
      auVar241._20_4_ = 0xb95e8083;
      auVar241._24_4_ = 0xb95e8083;
      auVar241._28_4_ = 0xb95e8083;
      auVar153 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      auVar172 = ZEXT3264(auVar153);
      auVar154 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar155 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar156 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar157 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar158 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar100 = vxorps_avx512vl(auVar100,auVar100);
      auVar159 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
      auVar174 = ZEXT3264(auVar159);
      for (uVar83 = 0; uVar83 != local_80; uVar83 = uVar83 + 1) {
        auVar176 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar175 = ZEXT864(0);
        if (lVar6 != 0) {
          auVar175 = ZEXT3264(*(undefined1 (*) [32])(lVar6 + uVar83 * 0x20));
        }
        pvVar7 = (this->weight_data_tm).data;
        lVar97 = 0;
        lVar86 = 0;
        auVar179 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar250 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar247 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar248 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar249 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar177 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar178 = ZEXT1664(ZEXT816(0) << 0x40);
        iVar92 = 0;
        while( true ) {
          if (iVar88 <= iVar92 + 7) break;
          auVar161 = *(undefined1 (*) [32])(*local_c8 + lVar86);
          auVar160 = vfmadd231ps_avx512vl
                               (auVar178._0_32_,auVar161,
                                *(undefined1 (*) [32])((long)pvVar7 + lVar86 + uVar98));
          auVar178 = ZEXT3264(auVar160);
          auVar160 = vfmadd231ps_avx512vl
                               (auVar177._0_32_,auVar161,
                                *(undefined1 (*) [32])((long)pvVar7 + lVar86 + lVar89));
          auVar177 = ZEXT3264(auVar160);
          auVar160 = vfmadd231ps_avx512vl
                               (auVar249._0_32_,auVar161,
                                *(undefined1 (*) [32])((long)pvVar7 + lVar86 + lVar90));
          auVar249 = ZEXT3264(auVar160);
          auVar160 = vfmadd231ps_avx512vl
                               (auVar248._0_32_,auVar161,
                                *(undefined1 (*) [32])((long)pvVar7 + lVar86 + lVar95));
          auVar248 = ZEXT3264(auVar160);
          auVar160 = vfmadd231ps_avx512vl
                               (auVar247._0_32_,auVar161,
                                *(undefined1 (*) [32])((long)pvVar7 + lVar86 + lVar96));
          auVar247 = ZEXT3264(auVar160);
          auVar160 = vfmadd231ps_avx512vl
                               (auVar250._0_32_,auVar161,
                                *(undefined1 (*) [32])((long)pvVar7 + lVar86 + lVar99));
          auVar250 = ZEXT3264(auVar160);
          auVar160 = vfmadd231ps_avx512vl
                               (auVar179._0_32_,auVar161,
                                *(undefined1 (*) [32])((long)pvVar7 + lVar86 + local_120));
          auVar179 = ZEXT3264(auVar160);
          auVar161 = vfmadd231ps_avx512vl
                               (auVar176._0_32_,auVar161,
                                *(undefined1 (*) [32])((long)pvVar7 + lVar86 + local_150));
          auVar176 = ZEXT3264(auVar161);
          iVar92 = iVar92 + 8;
          lVar86 = lVar86 + 0x20;
          lVar97 = lVar97 + 8;
        }
        for (; (int)lVar97 < iVar88; lVar97 = lVar97 + 1) {
          auVar120 = vinsertps_avx512f(ZEXT416(*(uint *)((long)pvVar7 + lVar97 * 4 + lVar96)),
                                       ZEXT416(*(uint *)((long)pvVar7 + lVar97 * 4 + lVar99)),0x10);
          auVar120 = vinsertps_avx512f(auVar120,ZEXT416(*(uint *)((long)pvVar7 +
                                                                 lVar97 * 4 + local_120)),0x20);
          auVar120 = vinsertps_avx512f(auVar120,ZEXT416(*(uint *)((long)pvVar7 +
                                                                 lVar97 * 4 + local_150)),0x30);
          auVar101 = vinsertps_avx512f(ZEXT416(*(uint *)((long)pvVar7 + lVar97 * 4 + uVar98)),
                                       ZEXT416(*(uint *)((long)pvVar7 + lVar97 * 4 + lVar89)),0x10);
          auVar101 = vinsertps_avx512f(auVar101,ZEXT416(*(uint *)((long)pvVar7 + lVar97 * 4 + lVar90
                                                                 )),0x20);
          auVar101 = vinsertps_avx512f(auVar101,ZEXT416(*(uint *)((long)pvVar7 + lVar97 * 4 + lVar95
                                                                 )),0x30);
          auVar160 = vinsertf32x4_avx512vl(ZEXT1632(auVar101),auVar120,1);
          uVar1 = *(undefined4 *)(*local_c8 + lVar97 * 4);
          auVar161._4_4_ = uVar1;
          auVar161._0_4_ = uVar1;
          auVar161._8_4_ = uVar1;
          auVar161._12_4_ = uVar1;
          auVar161._16_4_ = uVar1;
          auVar161._20_4_ = uVar1;
          auVar161._24_4_ = uVar1;
          auVar161._28_4_ = uVar1;
          auVar161 = vfmadd231ps_avx512vl(auVar175._0_32_,auVar160,auVar161);
          auVar175 = ZEXT3264(auVar161);
        }
        auVar161 = vhaddps_avx(auVar178._0_32_,auVar177._0_32_);
        auVar160 = vhaddps_avx(auVar249._0_32_,auVar248._0_32_);
        auVar160 = vhaddps_avx(auVar161,auVar160);
        auVar161 = vhaddps_avx(auVar247._0_32_,auVar250._0_32_);
        auVar168 = vhaddps_avx(auVar179._0_32_,auVar176._0_32_);
        auVar168 = vhaddps_avx(auVar161,auVar168);
        auVar161 = vblendps_avx(auVar160,auVar168,0xf0);
        auVar160 = vperm2f128_avx(auVar160,auVar168,0x21);
        auVar168._0_4_ = auVar160._0_4_ + auVar175._0_4_ + auVar161._0_4_;
        auVar168._4_4_ = auVar160._4_4_ + auVar175._4_4_ + auVar161._4_4_;
        auVar168._8_4_ = auVar160._8_4_ + auVar175._8_4_ + auVar161._8_4_;
        auVar168._12_4_ = auVar160._12_4_ + auVar175._12_4_ + auVar161._12_4_;
        auVar168._16_4_ = auVar160._16_4_ + auVar175._16_4_ + auVar161._16_4_;
        auVar168._20_4_ = auVar160._20_4_ + auVar175._20_4_ + auVar161._20_4_;
        auVar168._24_4_ = auVar160._24_4_ + auVar175._24_4_ + auVar161._24_4_;
        auVar168._28_4_ = auVar160._28_4_ + auVar175._28_4_ + auVar161._28_4_;
        auVar160 = auVar168;
        if (iVar81 - 1U < 6) {
          auVar160 = vmaxps_avx512vl(auVar168,ZEXT1632(auVar100));
          switch(iVar81) {
          case 2:
            auVar161 = vminps_avx512vl(auVar168,ZEXT1632(auVar100));
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var4);
            auVar64._4_4_ = uVar1;
            auVar64._0_4_ = uVar1;
            auVar64._8_4_ = uVar1;
            auVar64._12_4_ = uVar1;
            auVar64._16_4_ = uVar1;
            auVar64._20_4_ = uVar1;
            auVar64._24_4_ = uVar1;
            auVar64._28_4_ = uVar1;
            auVar160 = vfmadd231ps_avx512vl(auVar160,auVar161,auVar64);
            break;
          case 3:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var4);
            auVar62._4_4_ = uVar1;
            auVar62._0_4_ = uVar1;
            auVar62._8_4_ = uVar1;
            auVar62._12_4_ = uVar1;
            auVar62._16_4_ = uVar1;
            auVar62._20_4_ = uVar1;
            auVar62._24_4_ = uVar1;
            auVar62._28_4_ = uVar1;
            auVar161 = vmaxps_avx512vl(auVar168,auVar62);
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var4))[1];
            auVar63._4_4_ = uVar1;
            auVar63._0_4_ = uVar1;
            auVar63._8_4_ = uVar1;
            auVar63._12_4_ = uVar1;
            auVar63._16_4_ = uVar1;
            auVar63._20_4_ = uVar1;
            auVar63._24_4_ = uVar1;
            auVar63._28_4_ = uVar1;
            auVar160 = vminps_avx512vl(auVar161,auVar63);
            break;
          case 4:
            auVar60._8_4_ = 0x80000000;
            auVar60._0_8_ = 0x8000000080000000;
            auVar60._12_4_ = 0x80000000;
            auVar60._16_4_ = 0x80000000;
            auVar60._20_4_ = 0x80000000;
            auVar60._24_4_ = 0x80000000;
            auVar60._28_4_ = 0x80000000;
            auVar161 = vxorps_avx512vl(auVar168,auVar60);
            auVar161 = vminps_avx512vl(auVar161,auVar136);
            auVar160 = vmaxps_avx512vl(auVar161,auVar137);
            auVar168 = vfmadd231ps_avx512vl(auVar142,auVar160,auVar138);
            auVar161 = vroundps_avx(auVar168,1);
            uVar13 = vcmpps_avx512vl(auVar168,auVar161,1);
            auVar162 = vsubps_avx512vl(auVar161,auVar143);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar169._0_4_ = (float)((uint)bVar11 * auVar162._0_4_ | (uint)!bVar11 * auVar161._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar169._4_4_ = (float)((uint)bVar11 * auVar162._4_4_ | (uint)!bVar11 * auVar161._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar169._8_4_ = (float)((uint)bVar11 * auVar162._8_4_ | (uint)!bVar11 * auVar161._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar169._12_4_ =
                 (float)((uint)bVar11 * auVar162._12_4_ | (uint)!bVar11 * auVar161._12_4_);
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            auVar169._16_4_ =
                 (float)((uint)bVar11 * auVar162._16_4_ | (uint)!bVar11 * auVar161._16_4_);
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            auVar169._20_4_ =
                 (float)((uint)bVar11 * auVar162._20_4_ | (uint)!bVar11 * auVar161._20_4_);
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            auVar169._24_4_ =
                 (float)((uint)bVar11 * auVar162._24_4_ | (uint)!bVar11 * auVar161._24_4_);
            bVar11 = SUB81(uVar13 >> 7,0);
            auVar169._28_4_ =
                 (float)((uint)bVar11 * auVar162._28_4_ | (uint)!bVar11 * auVar161._28_4_);
            auVar120 = vfmsub231ps_fma(auVar160,auVar169,auVar144);
            auVar61._8_4_ = 0x395e8083;
            auVar61._0_8_ = 0x395e8083395e8083;
            auVar61._12_4_ = 0x395e8083;
            auVar61._16_4_ = 0x395e8083;
            auVar61._20_4_ = 0x395e8083;
            auVar61._24_4_ = 0x395e8083;
            auVar61._28_4_ = 0x395e8083;
            auVar161 = vfmsub231ps_avx512vl(ZEXT1632(auVar120),auVar169,auVar61);
            auVar68._4_4_ = auVar161._4_4_ * auVar161._4_4_;
            auVar68._0_4_ = auVar161._0_4_ * auVar161._0_4_;
            auVar68._8_4_ = auVar161._8_4_ * auVar161._8_4_;
            auVar68._12_4_ = auVar161._12_4_ * auVar161._12_4_;
            auVar68._16_4_ = auVar161._16_4_ * auVar161._16_4_;
            auVar68._20_4_ = auVar161._20_4_ * auVar161._20_4_;
            auVar68._24_4_ = auVar161._24_4_ * auVar161._24_4_;
            auVar68._28_4_ = auVar168._28_4_;
            auVar160 = vfmadd213ps_avx512vl(auVar145,auVar161,auVar139);
            auVar160 = vfmadd213ps_avx512vl(auVar160,auVar161,auVar140);
            auVar160 = vfmadd213ps_avx512vl(auVar160,auVar161,auVar141);
            auVar120 = vfmadd213ps_fma(auVar160,auVar161,auVar233);
            auVar120 = vfmadd213ps_fma(ZEXT1632(auVar120),auVar161,auVar142);
            auVar120 = vfmadd213ps_fma(ZEXT1632(auVar120),auVar68,auVar161);
            auVar185._0_4_ = auVar120._0_4_ + 1.0;
            auVar185._4_4_ = auVar120._4_4_ + 1.0;
            auVar185._8_4_ = auVar120._8_4_ + 1.0;
            auVar185._12_4_ = auVar120._12_4_ + 1.0;
            auVar185._16_4_ = 0x3f800000;
            auVar185._20_4_ = 0x3f800000;
            auVar185._24_4_ = 0x3f800000;
            auVar185._28_4_ = 0x3f800000;
            auVar192._0_4_ = (int)auVar169._0_4_;
            auVar192._4_4_ = (int)auVar169._4_4_;
            auVar192._8_4_ = (int)auVar169._8_4_;
            auVar192._12_4_ = (int)auVar169._12_4_;
            auVar192._16_4_ = (int)auVar169._16_4_;
            auVar192._20_4_ = (int)auVar169._20_4_;
            auVar192._24_4_ = (int)auVar169._24_4_;
            auVar192._28_4_ = (int)auVar169._28_4_;
            auVar161 = vpslld_avx2(auVar192,0x17);
            auVar161 = vpaddd_avx2(auVar237,auVar161);
            auVar120 = vfmadd213ps_fma(auVar161,auVar185,auVar143);
            auVar161 = vrcpps_avx(ZEXT1632(auVar120));
            auVar120 = vfmsub213ps_fma(ZEXT1632(auVar120),auVar161,auVar143);
            auVar120 = vfnmadd132ps_fma(ZEXT1632(auVar120),auVar161,auVar161);
            auVar160 = ZEXT1632(auVar120);
            break;
          case 5:
            auVar161 = vminps_avx512vl(auVar168,auVar136);
            auVar160 = vmaxps_avx512vl(auVar161,auVar137);
            auVar120 = vfmadd213ps_fma(auVar138,auVar160,auVar142);
            auVar161 = vroundps_avx(ZEXT1632(auVar120),1);
            uVar13 = vcmpps_avx512vl(ZEXT1632(auVar120),auVar161,1);
            auVar162 = vsubps_avx512vl(auVar161,auVar143);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar163._0_4_ = (float)((uint)bVar11 * auVar162._0_4_ | (uint)!bVar11 * auVar161._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar163._4_4_ = (float)((uint)bVar11 * auVar162._4_4_ | (uint)!bVar11 * auVar161._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar163._8_4_ = (float)((uint)bVar11 * auVar162._8_4_ | (uint)!bVar11 * auVar161._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar163._12_4_ =
                 (float)((uint)bVar11 * auVar162._12_4_ | (uint)!bVar11 * auVar161._12_4_);
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            auVar163._16_4_ =
                 (float)((uint)bVar11 * auVar162._16_4_ | (uint)!bVar11 * auVar161._16_4_);
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            auVar163._20_4_ =
                 (float)((uint)bVar11 * auVar162._20_4_ | (uint)!bVar11 * auVar161._20_4_);
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            auVar163._24_4_ =
                 (float)((uint)bVar11 * auVar162._24_4_ | (uint)!bVar11 * auVar161._24_4_);
            bVar11 = SUB81(uVar13 >> 7,0);
            auVar163._28_4_ =
                 (float)((uint)bVar11 * auVar162._28_4_ | (uint)!bVar11 * auVar161._28_4_);
            auVar120 = vfmsub231ps_fma(auVar160,auVar163,auVar144);
            auVar101 = vfnmsub231ps_fma(ZEXT1632(auVar120),auVar163,auVar241);
            auVar160 = ZEXT1632(auVar101);
            auVar161 = vfmadd213ps_avx512vl(auVar145,auVar160,auVar139);
            auVar161 = vfmadd213ps_avx512vl(auVar161,auVar160,auVar140);
            auVar161 = vfmadd213ps_avx512vl(auVar161,auVar160,auVar141);
            auVar160 = ZEXT1632(auVar101);
            auVar120 = vfmadd213ps_fma(auVar161,auVar160,auVar233);
            auVar120 = vfmadd213ps_fma(ZEXT1632(auVar120),auVar160,auVar142);
            auVar120 = vfmadd213ps_fma(ZEXT1632(auVar120),
                                       ZEXT1632(CONCAT412(auVar101._12_4_ * auVar101._12_4_,
                                                          CONCAT48(auVar101._8_4_ * auVar101._8_4_,
                                                                   CONCAT44(auVar101._4_4_ *
                                                                            auVar101._4_4_,
                                                                            auVar101._0_4_ *
                                                                            auVar101._0_4_)))),
                                       auVar160);
            auVar190._0_4_ = auVar120._0_4_ + 1.0;
            auVar190._4_4_ = auVar120._4_4_ + 1.0;
            auVar190._8_4_ = auVar120._8_4_ + 1.0;
            auVar190._12_4_ = auVar120._12_4_ + 1.0;
            auVar190._16_4_ = 0x3f800000;
            auVar190._20_4_ = 0x3f800000;
            auVar190._24_4_ = 0x3f800000;
            auVar190._28_4_ = 0x3f800000;
            auVar199._0_4_ = (int)auVar163._0_4_;
            auVar199._4_4_ = (int)auVar163._4_4_;
            auVar199._8_4_ = (int)auVar163._8_4_;
            auVar199._12_4_ = (int)auVar163._12_4_;
            auVar199._16_4_ = (int)auVar163._16_4_;
            auVar199._20_4_ = (int)auVar163._20_4_;
            auVar199._24_4_ = (int)auVar163._24_4_;
            auVar199._28_4_ = (int)auVar163._28_4_;
            auVar161 = vpslld_avx2(auVar199,0x17);
            auVar161 = vpaddd_avx2(auVar237,auVar161);
            auVar120 = vfmadd213ps_fma(auVar161,auVar190,auVar143);
            uVar13 = vcmpps_avx512vl(ZEXT1632(auVar120),ZEXT1632(auVar100),2);
            auVar52._8_4_ = 0x800000;
            auVar52._0_8_ = 0x80000000800000;
            auVar52._12_4_ = 0x800000;
            auVar52._16_4_ = 0x800000;
            auVar52._20_4_ = 0x800000;
            auVar52._24_4_ = 0x800000;
            auVar52._28_4_ = 0x800000;
            auVar161 = vmaxps_avx512vl(ZEXT1632(auVar120),auVar52);
            auVar200 = vpsrld_avx2(auVar161,0x17);
            auVar205._8_4_ = 0x807fffff;
            auVar205._0_8_ = 0x807fffff807fffff;
            auVar205._12_4_ = 0x807fffff;
            auVar205._16_4_ = 0x807fffff;
            auVar205._20_4_ = 0x807fffff;
            auVar205._24_4_ = 0x807fffff;
            auVar205._28_4_ = 0x807fffff;
            auVar53._8_4_ = 0x3f000000;
            auVar53._0_8_ = 0x3f0000003f000000;
            auVar53._12_4_ = 0x3f000000;
            auVar53._16_4_ = 0x3f000000;
            auVar53._20_4_ = 0x3f000000;
            auVar53._24_4_ = 0x3f000000;
            auVar53._28_4_ = 0x3f000000;
            auVar161 = vpternlogd_avx512vl(auVar161,auVar205,auVar53,0xea);
            auVar54._8_4_ = 0x3f3504f3;
            auVar54._0_8_ = 0x3f3504f33f3504f3;
            auVar54._12_4_ = 0x3f3504f3;
            auVar54._16_4_ = 0x3f3504f3;
            auVar54._20_4_ = 0x3f3504f3;
            auVar54._24_4_ = 0x3f3504f3;
            auVar54._28_4_ = 0x3f3504f3;
            uVar14 = vcmpps_avx512vl(auVar161,auVar54,1);
            auVar160 = vaddps_avx512vl(auVar161,auVar153);
            auVar162 = vaddps_avx512vl(auVar160,auVar161);
            bVar11 = (bool)((byte)uVar14 & 1);
            auVar164._0_4_ = (float)((uint)bVar11 * auVar162._0_4_ | (uint)!bVar11 * auVar160._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
            auVar164._4_4_ = (float)((uint)bVar11 * auVar162._4_4_ | (uint)!bVar11 * auVar160._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
            auVar164._8_4_ = (float)((uint)bVar11 * auVar162._8_4_ | (uint)!bVar11 * auVar160._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
            auVar164._12_4_ =
                 (float)((uint)bVar11 * auVar162._12_4_ | (uint)!bVar11 * auVar160._12_4_);
            bVar11 = (bool)((byte)(uVar14 >> 4) & 1);
            auVar164._16_4_ =
                 (float)((uint)bVar11 * auVar162._16_4_ | (uint)!bVar11 * auVar160._16_4_);
            bVar11 = (bool)((byte)(uVar14 >> 5) & 1);
            auVar164._20_4_ =
                 (float)((uint)bVar11 * auVar162._20_4_ | (uint)!bVar11 * auVar160._20_4_);
            bVar11 = (bool)((byte)(uVar14 >> 6) & 1);
            auVar164._24_4_ =
                 (float)((uint)bVar11 * auVar162._24_4_ | (uint)!bVar11 * auVar160._24_4_);
            bVar11 = SUB81(uVar14 >> 7,0);
            auVar164._28_4_ = (uint)bVar11 * auVar162._28_4_ | (uint)!bVar11 * auVar160._28_4_;
            auVar66._4_4_ = auVar164._4_4_ * auVar164._4_4_;
            auVar66._0_4_ = auVar164._0_4_ * auVar164._0_4_;
            auVar66._8_4_ = auVar164._8_4_ * auVar164._8_4_;
            auVar66._12_4_ = auVar164._12_4_ * auVar164._12_4_;
            auVar66._16_4_ = auVar164._16_4_ * auVar164._16_4_;
            auVar66._20_4_ = auVar164._20_4_ * auVar164._20_4_;
            auVar66._24_4_ = auVar164._24_4_ * auVar164._24_4_;
            auVar66._28_4_ = auVar161._28_4_;
            auVar55._8_4_ = 0xbdebd1b8;
            auVar55._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar55._12_4_ = 0xbdebd1b8;
            auVar55._16_4_ = 0xbdebd1b8;
            auVar55._20_4_ = 0xbdebd1b8;
            auVar55._24_4_ = 0xbdebd1b8;
            auVar55._28_4_ = 0xbdebd1b8;
            auVar161 = vfmadd213ps_avx512vl(auVar154,auVar164,auVar55);
            auVar56._8_4_ = 0x3def251a;
            auVar56._0_8_ = 0x3def251a3def251a;
            auVar56._12_4_ = 0x3def251a;
            auVar56._16_4_ = 0x3def251a;
            auVar56._20_4_ = 0x3def251a;
            auVar56._24_4_ = 0x3def251a;
            auVar56._28_4_ = 0x3def251a;
            auVar161 = vfmadd213ps_avx512vl(auVar161,auVar164,auVar56);
            auVar57._8_4_ = 0xbdfe5d4f;
            auVar57._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar57._12_4_ = 0xbdfe5d4f;
            auVar57._16_4_ = 0xbdfe5d4f;
            auVar57._20_4_ = 0xbdfe5d4f;
            auVar57._24_4_ = 0xbdfe5d4f;
            auVar57._28_4_ = 0xbdfe5d4f;
            auVar161 = vfmadd213ps_avx512vl(auVar161,auVar164,auVar57);
            auVar58._8_4_ = 0x3e11e9bf;
            auVar58._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar58._12_4_ = 0x3e11e9bf;
            auVar58._16_4_ = 0x3e11e9bf;
            auVar58._20_4_ = 0x3e11e9bf;
            auVar58._24_4_ = 0x3e11e9bf;
            auVar58._28_4_ = 0x3e11e9bf;
            auVar161 = vfmadd213ps_avx512vl(auVar161,auVar164,auVar58);
            auVar161 = vfmadd213ps_avx512vl(auVar161,auVar164,auVar155);
            auVar161 = vfmadd213ps_avx512vl(auVar161,auVar164,auVar156);
            auVar161 = vfmadd213ps_avx512vl(auVar161,auVar164,auVar157);
            auVar161 = vfmadd213ps_avx512vl(auVar161,auVar164,auVar158);
            auVar67._4_4_ = auVar164._4_4_ * auVar164._4_4_ * auVar164._4_4_ * auVar161._4_4_;
            auVar67._0_4_ = auVar164._0_4_ * auVar164._0_4_ * auVar164._0_4_ * auVar161._0_4_;
            auVar67._8_4_ = auVar164._8_4_ * auVar164._8_4_ * auVar164._8_4_ * auVar161._8_4_;
            auVar67._12_4_ = auVar164._12_4_ * auVar164._12_4_ * auVar164._12_4_ * auVar161._12_4_;
            auVar67._16_4_ = auVar164._16_4_ * auVar164._16_4_ * auVar164._16_4_ * auVar161._16_4_;
            auVar67._20_4_ = auVar164._20_4_ * auVar164._20_4_ * auVar164._20_4_ * auVar161._20_4_;
            auVar67._24_4_ = auVar164._24_4_ * auVar164._24_4_ * auVar164._24_4_ * auVar161._24_4_;
            auVar67._28_4_ = auVar161._28_4_;
            auVar59._8_4_ = 0xffffff82;
            auVar59._0_8_ = 0xffffff82ffffff82;
            auVar59._12_4_ = 0xffffff82;
            auVar59._16_4_ = 0xffffff82;
            auVar59._20_4_ = 0xffffff82;
            auVar59._24_4_ = 0xffffff82;
            auVar59._28_4_ = 0xffffff82;
            auVar161 = vpaddd_avx512vl(auVar200,auVar59);
            auVar161 = vcvtdq2ps_avx(auVar161);
            auVar160 = vsubps_avx512vl(auVar161,auVar143);
            bVar11 = (bool)((byte)uVar14 & 1);
            auVar165._0_4_ = (uint)bVar11 * auVar160._0_4_ | (uint)!bVar11 * auVar161._0_4_;
            bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
            auVar165._4_4_ = (uint)bVar11 * auVar160._4_4_ | (uint)!bVar11 * auVar161._4_4_;
            bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
            auVar165._8_4_ = (uint)bVar11 * auVar160._8_4_ | (uint)!bVar11 * auVar161._8_4_;
            bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
            auVar165._12_4_ = (uint)bVar11 * auVar160._12_4_ | (uint)!bVar11 * auVar161._12_4_;
            bVar11 = (bool)((byte)(uVar14 >> 4) & 1);
            auVar165._16_4_ = (uint)bVar11 * auVar160._16_4_ | (uint)!bVar11 * auVar161._16_4_;
            bVar11 = (bool)((byte)(uVar14 >> 5) & 1);
            auVar165._20_4_ = (uint)bVar11 * auVar160._20_4_ | (uint)!bVar11 * auVar161._20_4_;
            bVar11 = (bool)((byte)(uVar14 >> 6) & 1);
            auVar165._24_4_ = (uint)bVar11 * auVar160._24_4_ | (uint)!bVar11 * auVar161._24_4_;
            bVar11 = SUB81(uVar14 >> 7,0);
            auVar165._28_4_ = (uint)bVar11 * auVar160._28_4_ | (uint)!bVar11 * auVar161._28_4_;
            auVar120 = vfmadd231ps_fma(auVar67,auVar165,auVar241);
            auVar120 = vfmsub231ps_fma(ZEXT1632(auVar120),auVar142,auVar66);
            auVar161 = vsubps_avx(ZEXT1632(auVar120),auVar164);
            auVar120 = vfmsub231ps_fma(auVar161,auVar144,auVar165);
            auVar161 = vmulps_avx512vl(ZEXT1632(auVar120),auVar159);
            auVar160 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar166._0_4_ = (uint)bVar11 * auVar160._0_4_ | (uint)!bVar11 * auVar161._0_4_;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar166._4_4_ = (uint)bVar11 * auVar160._4_4_ | (uint)!bVar11 * auVar161._4_4_;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar166._8_4_ = (uint)bVar11 * auVar160._8_4_ | (uint)!bVar11 * auVar161._8_4_;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar166._12_4_ = (uint)bVar11 * auVar160._12_4_ | (uint)!bVar11 * auVar161._12_4_;
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            auVar166._16_4_ = (uint)bVar11 * auVar160._16_4_ | (uint)!bVar11 * auVar161._16_4_;
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            auVar166._20_4_ = (uint)bVar11 * auVar160._20_4_ | (uint)!bVar11 * auVar161._20_4_;
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            auVar166._24_4_ = (uint)bVar11 * auVar160._24_4_ | (uint)!bVar11 * auVar161._24_4_;
            bVar11 = SUB81(uVar13 >> 7,0);
            auVar166._28_4_ = (uint)bVar11 * auVar160._28_4_ | (uint)!bVar11 * auVar161._28_4_;
            auVar161 = vminps_avx512vl(auVar166,auVar136);
            auVar160 = vmaxps_avx512vl(auVar161,auVar137);
            auVar120 = vfmadd213ps_fma(auVar138,auVar160,auVar142);
            auVar161 = vroundps_avx(ZEXT1632(auVar120),1);
            uVar13 = vcmpps_avx512vl(ZEXT1632(auVar120),auVar161,1);
            auVar162 = vsubps_avx512vl(auVar161,auVar143);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar167._0_4_ = (float)((uint)bVar11 * auVar162._0_4_ | (uint)!bVar11 * auVar161._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar167._4_4_ = (float)((uint)bVar11 * auVar162._4_4_ | (uint)!bVar11 * auVar161._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar167._8_4_ = (float)((uint)bVar11 * auVar162._8_4_ | (uint)!bVar11 * auVar161._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar167._12_4_ =
                 (float)((uint)bVar11 * auVar162._12_4_ | (uint)!bVar11 * auVar161._12_4_);
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            auVar167._16_4_ =
                 (float)((uint)bVar11 * auVar162._16_4_ | (uint)!bVar11 * auVar161._16_4_);
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            auVar167._20_4_ =
                 (float)((uint)bVar11 * auVar162._20_4_ | (uint)!bVar11 * auVar161._20_4_);
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            auVar167._24_4_ =
                 (float)((uint)bVar11 * auVar162._24_4_ | (uint)!bVar11 * auVar161._24_4_);
            bVar11 = SUB81(uVar13 >> 7,0);
            auVar167._28_4_ =
                 (float)((uint)bVar11 * auVar162._28_4_ | (uint)!bVar11 * auVar161._28_4_);
            auVar120 = vfmsub231ps_fma(auVar160,auVar167,auVar144);
            auVar101 = vfnmsub231ps_fma(ZEXT1632(auVar120),auVar167,auVar241);
            auVar160 = ZEXT1632(auVar101);
            auVar161 = vfmadd213ps_avx512vl(auVar145,auVar160,auVar139);
            auVar161 = vfmadd213ps_avx512vl(auVar161,auVar160,auVar140);
            auVar161 = vfmadd213ps_avx512vl(auVar161,auVar160,auVar141);
            auVar160 = ZEXT1632(auVar101);
            auVar120 = vfmadd213ps_fma(auVar161,auVar160,auVar233);
            auVar120 = vfmadd213ps_fma(ZEXT1632(auVar120),auVar160,auVar142);
            auVar120 = vfmadd213ps_fma(ZEXT1632(auVar120),
                                       ZEXT1632(CONCAT412(auVar101._12_4_ * auVar101._12_4_,
                                                          CONCAT48(auVar101._8_4_ * auVar101._8_4_,
                                                                   CONCAT44(auVar101._4_4_ *
                                                                            auVar101._4_4_,
                                                                            auVar101._0_4_ *
                                                                            auVar101._0_4_)))),
                                       auVar160);
            auVar191._0_4_ = auVar120._0_4_ + 1.0;
            auVar191._4_4_ = auVar120._4_4_ + 1.0;
            auVar191._8_4_ = auVar120._8_4_ + 1.0;
            auVar191._12_4_ = auVar120._12_4_ + 1.0;
            auVar191._16_4_ = 0x3f800000;
            auVar191._20_4_ = 0x3f800000;
            auVar191._24_4_ = 0x3f800000;
            auVar191._28_4_ = 0x3f800000;
            auVar201._0_4_ = (int)auVar167._0_4_;
            auVar201._4_4_ = (int)auVar167._4_4_;
            auVar201._8_4_ = (int)auVar167._8_4_;
            auVar201._12_4_ = (int)auVar167._12_4_;
            auVar201._16_4_ = (int)auVar167._16_4_;
            auVar201._20_4_ = (int)auVar167._20_4_;
            auVar201._24_4_ = (int)auVar167._24_4_;
            auVar201._28_4_ = (int)auVar167._28_4_;
            auVar161 = vpslld_avx2(auVar201,0x17);
            auVar161 = vpaddd_avx2(auVar237,auVar161);
            auVar120 = vfmadd213ps_fma(auVar161,auVar191,auVar143);
            auVar161 = vrcpps_avx(ZEXT1632(auVar120));
            auVar120 = vfmsub213ps_fma(ZEXT1632(auVar120),auVar161,auVar143);
            auVar120 = vfnmadd132ps_fma(ZEXT1632(auVar120),auVar161,auVar161);
            auVar162 = vfnmadd213ps_avx512vl(ZEXT1632(auVar120),auVar159,auVar153);
            auVar160._4_4_ = auVar162._4_4_ * auVar168._4_4_;
            auVar160._0_4_ = auVar162._0_4_ * auVar168._0_4_;
            auVar160._8_4_ = auVar162._8_4_ * auVar168._8_4_;
            auVar160._12_4_ = auVar162._12_4_ * auVar168._12_4_;
            auVar160._16_4_ = auVar162._16_4_ * auVar168._16_4_;
            auVar160._20_4_ = auVar162._20_4_ * auVar168._20_4_;
            auVar160._24_4_ = auVar162._24_4_ * auVar168._24_4_;
            auVar160._28_4_ = auVar161._28_4_;
            break;
          case 6:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var4);
            auVar200._4_4_ = uVar1;
            auVar200._0_4_ = uVar1;
            auVar200._8_4_ = uVar1;
            auVar200._12_4_ = uVar1;
            auVar200._16_4_ = uVar1;
            auVar200._20_4_ = uVar1;
            auVar200._24_4_ = uVar1;
            auVar200._28_4_ = uVar1;
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var4))[1];
            auVar162._4_4_ = uVar1;
            auVar162._0_4_ = uVar1;
            auVar162._8_4_ = uVar1;
            auVar162._12_4_ = uVar1;
            auVar162._16_4_ = uVar1;
            auVar162._20_4_ = uVar1;
            auVar162._24_4_ = uVar1;
            auVar162._28_4_ = uVar1;
            auVar161 = vfmadd213ps_avx512vl(auVar200,auVar168,auVar162);
            auVar161 = vmaxps_avx512vl(auVar161,ZEXT1632(auVar100));
            auVar161 = vminps_avx(auVar161,auVar143);
            auVar160._4_4_ = auVar161._4_4_ * auVar168._4_4_;
            auVar160._0_4_ = auVar161._0_4_ * auVar168._0_4_;
            auVar160._8_4_ = auVar161._8_4_ * auVar168._8_4_;
            auVar160._12_4_ = auVar161._12_4_ * auVar168._12_4_;
            auVar160._16_4_ = auVar161._16_4_ * auVar168._16_4_;
            auVar160._20_4_ = auVar161._20_4_ * auVar168._20_4_;
            auVar160._24_4_ = auVar161._24_4_ * auVar168._24_4_;
            auVar160._28_4_ = auVar161._28_4_;
          }
        }
        *(undefined1 (*) [32])((long)top_blob->data + uVar83 * 0x20) = auVar160;
        uVar98 = uVar98 + lVar91;
        lVar89 = lVar89 + lVar91;
        lVar90 = lVar90 + lVar91;
        lVar95 = lVar95 + lVar91;
        lVar96 = lVar96 + lVar91;
        lVar99 = lVar99 + lVar91;
        local_120 = local_120 + lVar91;
        local_150 = local_150 + lVar91;
      }
      uVar98 = (long)(int)uVar3 & 0xfffffffffffffff8;
      uVar82 = uVar3 >> 2 & 1;
      lVar89 = lVar94 * uVar98 * 4;
      lVar91 = lVar94 * 0x10;
      lVar90 = (uVar98 + 1) * lVar94 * 4;
      lVar95 = (uVar98 + 2) * lVar94 * 4;
      local_120 = (uVar98 + 3) * lVar94 * 4;
      uVar83 = 0;
      auVar183 = ZEXT816(0);
      auVar100 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar112._8_4_ = 0x3f000000;
      auVar112._0_8_ = 0x3f0000003f000000;
      auVar112._12_4_ = 0x3f000000;
      auVar108._8_4_ = 0x3fb8aa3b;
      auVar108._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar108._12_4_ = 0x3fb8aa3b;
      auVar109._8_4_ = 0x3f800000;
      auVar109._0_8_ = 0x3f8000003f800000;
      auVar109._12_4_ = 0x3f800000;
      auVar110._8_4_ = 0x3f318000;
      auVar110._0_8_ = 0x3f3180003f318000;
      auVar110._12_4_ = 0x3f318000;
      auVar111._8_4_ = 0x39506967;
      auVar111._0_8_ = 0x3950696739506967;
      auVar111._12_4_ = 0x39506967;
      auVar222._8_4_ = 0x3ab743ce;
      auVar222._0_8_ = 0x3ab743ce3ab743ce;
      auVar222._12_4_ = 0x3ab743ce;
      auVar225._8_4_ = 0x3c088908;
      auVar225._0_8_ = 0x3c0889083c088908;
      auVar225._12_4_ = 0x3c088908;
      auVar228._8_4_ = 0x3d2aa9c1;
      auVar228._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar228._12_4_ = 0x3d2aa9c1;
      auVar231._8_4_ = 0x3e2aaaaa;
      auVar231._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar231._12_4_ = 0x3e2aaaaa;
      auVar235._8_4_ = 0x3f800000;
      auVar235._0_8_ = 0x3f8000003f800000;
      auVar235._12_4_ = 0x3f800000;
      auVar239._8_4_ = 0xb95e8083;
      auVar239._0_8_ = 0xb95e8083b95e8083;
      auVar239._12_4_ = 0xb95e8083;
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar103 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      for (; uVar83 != uVar82; uVar83 = uVar83 + 1) {
        lVar96 = uVar98 + uVar83 * 4;
        if (lVar6 == 0) {
          auVar126 = vxorps_avx512vl(auVar174._0_16_,auVar174._0_16_);
        }
        else {
          auVar126 = *(undefined1 (*) [16])(lVar6 + lVar96 * 4);
        }
        pvVar7 = (this->weight_data_tm).data;
        lVar86 = 0;
        auVar176 = ZEXT1664(ZEXT816(0) << 0x40);
        lVar99 = 0;
        auVar250 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar174 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar175 = ZEXT1664(ZEXT816(0) << 0x40);
        iVar92 = 0;
        while( true ) {
          if (iVar88 <= iVar92 + 7) break;
          auVar136 = *(undefined1 (*) [32])(*local_c8 + lVar99);
          auVar170 = ZEXT3264(auVar136);
          auVar137 = vfmadd231ps_avx512vl
                               (auVar176._0_32_,auVar136,
                                *(undefined1 (*) [32])((long)pvVar7 + lVar99 + lVar89));
          auVar176 = ZEXT3264(auVar137);
          auVar137 = vfmadd231ps_avx512vl
                               (auVar250._0_32_,auVar136,
                                *(undefined1 (*) [32])((long)pvVar7 + lVar99 + lVar90));
          auVar250 = ZEXT3264(auVar137);
          auVar137 = vfmadd231ps_avx512vl
                               (auVar174._0_32_,auVar136,
                                *(undefined1 (*) [32])((long)pvVar7 + lVar99 + lVar95));
          auVar174 = ZEXT3264(auVar137);
          auVar136 = vfmadd231ps_avx512vl
                               (auVar175._0_32_,auVar136,
                                *(undefined1 (*) [32])((long)pvVar7 + lVar99 + local_120));
          auVar175 = ZEXT3264(auVar136);
          iVar92 = iVar92 + 8;
          lVar99 = lVar99 + 0x20;
          lVar86 = lVar86 + 8;
        }
        auVar122 = vxorps_avx512vl(auVar170._0_16_,auVar170._0_16_);
        auVar123 = vxorps_avx512vl(auVar171._0_16_,auVar171._0_16_);
        auVar124 = vxorps_avx512vl(auVar172._0_16_,auVar172._0_16_);
        auVar125 = vxorps_avx512vl(auVar173._0_16_,auVar173._0_16_);
        for (; auVar173 = ZEXT1664(auVar125), iVar92 + 3 < iVar88; iVar92 = iVar92 + 4) {
          auVar127 = *(undefined1 (*) [16])(*local_c8 + lVar99);
          auVar122 = vfmadd231ps_avx512vl
                               (auVar122,auVar127,
                                *(undefined1 (*) [16])((long)pvVar7 + lVar99 + lVar89));
          auVar123 = vfmadd231ps_avx512vl
                               (auVar123,auVar127,
                                *(undefined1 (*) [16])((long)pvVar7 + lVar99 + lVar90));
          auVar124 = vfmadd231ps_avx512vl
                               (auVar124,auVar127,
                                *(undefined1 (*) [16])((long)pvVar7 + lVar99 + lVar95));
          auVar125 = vfmadd231ps_avx512vl
                               (auVar125,auVar127,
                                *(undefined1 (*) [16])((long)pvVar7 + lVar99 + local_120));
          lVar99 = lVar99 + 0x10;
          lVar86 = lVar86 + 4;
        }
        for (; (int)lVar86 < iVar88; lVar86 = lVar86 + 1) {
          auVar127 = vinsertps_avx512f(ZEXT416(*(uint *)((long)pvVar7 + lVar86 * 4 + lVar89)),
                                       ZEXT416(*(uint *)((long)pvVar7 + lVar86 * 4 + lVar90)),0x10);
          auVar127 = vinsertps_avx512f(auVar127,ZEXT416(*(uint *)((long)pvVar7 + lVar86 * 4 + lVar95
                                                                 )),0x20);
          auVar127 = vinsertps_avx512f(auVar127,ZEXT416(*(uint *)((long)pvVar7 +
                                                                 lVar86 * 4 + local_120)),0x30);
          uVar1 = *(undefined4 *)(*local_c8 + lVar86 * 4);
          auVar128._4_4_ = uVar1;
          auVar128._0_4_ = uVar1;
          auVar128._8_4_ = uVar1;
          auVar128._12_4_ = uVar1;
          auVar126 = vfmadd231ps_avx512vl(auVar126,auVar127,auVar128);
        }
        auVar136 = vhaddps_avx(auVar176._0_32_,auVar250._0_32_);
        auVar137 = vhaddps_avx(auVar174._0_32_,auVar175._0_32_);
        auVar136 = vhaddps_avx(auVar136,auVar137);
        auVar127 = vunpcklps_avx512vl(auVar122,auVar123);
        auVar128 = vunpcklps_avx512vl(auVar124,auVar125);
        auVar129 = vunpckhps_avx512vl(auVar122,auVar123);
        auVar124 = vunpckhps_avx512vl(auVar124,auVar125);
        auVar171 = ZEXT1664(auVar124);
        auVar122 = vmovlhps_avx512f(auVar127,auVar128);
        auVar172 = ZEXT1664(auVar122);
        auVar123 = vunpckhpd_avx(auVar127,auVar128);
        auVar122 = vaddps_avx512vl(auVar123,auVar122);
        auVar123 = vmovlhps_avx512f(auVar129,auVar124);
        auVar124 = vunpckhpd_avx512vl(auVar129,auVar124);
        auVar170 = ZEXT1664(auVar124);
        auVar123 = vaddps_avx512vl(auVar123,auVar124);
        auVar124._0_4_ = auVar123._0_4_ + auVar122._0_4_;
        auVar124._4_4_ = auVar123._4_4_ + auVar122._4_4_;
        auVar124._8_4_ = auVar123._8_4_ + auVar122._8_4_;
        auVar124._12_4_ = auVar123._12_4_ + auVar122._12_4_;
        auVar126 = vaddps_avx512vl(auVar124,auVar126);
        auVar123._0_4_ = auVar126._0_4_ + auVar136._0_4_;
        auVar123._4_4_ = auVar126._4_4_ + auVar136._4_4_;
        auVar123._8_4_ = auVar126._8_4_ + auVar136._8_4_;
        auVar123._12_4_ = auVar126._12_4_ + auVar136._12_4_;
        auVar123 = vaddps_avx512vl(auVar123,auVar136._16_16_);
        auVar174 = ZEXT1664(auVar123);
        auVar126 = auVar123;
        if (iVar81 - 1U < 6) {
          auVar126 = vmaxps_avx512vl(auVar123,auVar183);
          switch(iVar81) {
          case 2:
            auVar123 = vminps_avx512vl(auVar123,auVar183);
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var4);
            auVar37._4_4_ = uVar1;
            auVar37._0_4_ = uVar1;
            auVar37._8_4_ = uVar1;
            auVar37._12_4_ = uVar1;
            auVar126 = vfmadd231ps_avx512vl(auVar126,auVar123,auVar37);
            break;
          case 3:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var4);
            auVar35._4_4_ = uVar1;
            auVar35._0_4_ = uVar1;
            auVar35._8_4_ = uVar1;
            auVar35._12_4_ = uVar1;
            auVar126 = vmaxps_avx512vl(auVar123,auVar35);
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var4))[1];
            auVar36._4_4_ = uVar1;
            auVar36._0_4_ = uVar1;
            auVar36._8_4_ = uVar1;
            auVar36._12_4_ = uVar1;
            auVar126 = vminps_avx512vl(auVar126,auVar36);
            break;
          case 4:
            auVar33._8_4_ = 0x80000000;
            auVar33._0_8_ = 0x8000000080000000;
            auVar33._12_4_ = 0x80000000;
            auVar126 = vxorps_avx512vl(auVar123,auVar33);
            auVar126 = vminps_avx512vl(auVar126,auVar100);
            auVar122 = vmaxps_avx512vl(auVar126,auVar120);
            auVar123 = vfmadd231ps_fma(auVar112,auVar122,auVar108);
            auVar215._0_4_ = (int)auVar123._0_4_;
            auVar215._4_4_ = (int)auVar123._4_4_;
            auVar215._8_4_ = (int)auVar123._8_4_;
            auVar215._12_4_ = (int)auVar123._12_4_;
            auVar126 = vcvtdq2ps_avx(auVar215);
            uVar13 = vcmpps_avx512vl(auVar123,auVar126,1);
            auVar123 = vsubps_avx512vl(auVar126,auVar109);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar135._0_4_ = (float)((uint)bVar11 * auVar123._0_4_ | (uint)!bVar11 * auVar126._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar135._4_4_ = (float)((uint)bVar11 * auVar123._4_4_ | (uint)!bVar11 * auVar126._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar135._8_4_ = (float)((uint)bVar11 * auVar123._8_4_ | (uint)!bVar11 * auVar126._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar135._12_4_ =
                 (float)((uint)bVar11 * auVar123._12_4_ | (uint)!bVar11 * auVar126._12_4_);
            auVar126 = vfmsub231ps_fma(auVar122,auVar135,auVar110);
            auVar34._8_4_ = 0x395e8083;
            auVar34._0_8_ = 0x395e8083395e8083;
            auVar34._12_4_ = 0x395e8083;
            auVar123 = vfmsub231ps_avx512vl(auVar126,auVar135,auVar34);
            auVar197._0_4_ = auVar123._0_4_ * auVar123._0_4_;
            auVar197._4_4_ = auVar123._4_4_ * auVar123._4_4_;
            auVar197._8_4_ = auVar123._8_4_ * auVar123._8_4_;
            auVar197._12_4_ = auVar123._12_4_ * auVar123._12_4_;
            auVar126 = vfmadd213ps_fma(auVar111,auVar123,auVar222);
            auVar126 = vfmadd213ps_fma(auVar126,auVar123,auVar225);
            auVar126 = vfmadd213ps_fma(auVar126,auVar123,auVar228);
            auVar126 = vfmadd213ps_fma(auVar126,auVar123,auVar231);
            auVar126 = vfmadd213ps_fma(auVar126,auVar123,auVar112);
            auVar126 = vfmadd213ps_fma(auVar126,auVar197,auVar123);
            auVar198._0_4_ = auVar126._0_4_ + 1.0;
            auVar198._4_4_ = auVar126._4_4_ + 1.0;
            auVar198._8_4_ = auVar126._8_4_ + 1.0;
            auVar198._12_4_ = auVar126._12_4_ + 1.0;
            auVar189._0_4_ = (int)auVar135._0_4_;
            auVar189._4_4_ = (int)auVar135._4_4_;
            auVar189._8_4_ = (int)auVar135._8_4_;
            auVar189._12_4_ = (int)auVar135._12_4_;
            auVar126 = vpslld_avx(auVar189,0x17);
            auVar126 = vpaddd_avx(auVar235,auVar126);
            auVar123 = vfmadd213ps_fma(auVar126,auVar198,auVar109);
            auVar126 = vrcpps_avx(auVar123);
            auVar123 = vfmsub213ps_fma(auVar123,auVar126,auVar109);
            auVar126 = vfnmadd132ps_fma(auVar123,auVar126,auVar126);
            break;
          case 5:
            auVar126 = vminps_avx512vl(auVar123,auVar100);
            auVar124 = vmaxps_avx512vl(auVar126,auVar120);
            auVar122 = vfmadd213ps_fma(auVar108,auVar124,auVar112);
            auVar211._0_4_ = (int)auVar122._0_4_;
            auVar211._4_4_ = (int)auVar122._4_4_;
            auVar211._8_4_ = (int)auVar122._8_4_;
            auVar211._12_4_ = (int)auVar122._12_4_;
            auVar126 = vcvtdq2ps_avx(auVar211);
            uVar13 = vcmpps_avx512vl(auVar122,auVar126,1);
            auVar122 = vsubps_avx512vl(auVar126,auVar109);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar130._0_4_ = (float)((uint)bVar11 * auVar122._0_4_ | (uint)!bVar11 * auVar126._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar130._4_4_ = (float)((uint)bVar11 * auVar122._4_4_ | (uint)!bVar11 * auVar126._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar130._8_4_ = (float)((uint)bVar11 * auVar122._8_4_ | (uint)!bVar11 * auVar126._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar130._12_4_ =
                 (float)((uint)bVar11 * auVar122._12_4_ | (uint)!bVar11 * auVar126._12_4_);
            auVar126 = vfmsub231ps_fma(auVar124,auVar130,auVar110);
            auVar122 = vfnmsub231ps_fma(auVar126,auVar130,auVar239);
            auVar193._0_4_ = auVar122._0_4_ * auVar122._0_4_;
            auVar193._4_4_ = auVar122._4_4_ * auVar122._4_4_;
            auVar193._8_4_ = auVar122._8_4_ * auVar122._8_4_;
            auVar193._12_4_ = auVar122._12_4_ * auVar122._12_4_;
            auVar126 = vfmadd213ps_fma(auVar111,auVar122,auVar222);
            auVar126 = vfmadd213ps_fma(auVar126,auVar122,auVar225);
            auVar126 = vfmadd213ps_fma(auVar126,auVar122,auVar228);
            auVar126 = vfmadd213ps_fma(auVar126,auVar122,auVar231);
            auVar126 = vfmadd213ps_fma(auVar126,auVar122,auVar112);
            auVar126 = vfmadd213ps_fma(auVar126,auVar193,auVar122);
            auVar186._0_4_ = auVar126._0_4_ + 1.0;
            auVar186._4_4_ = auVar126._4_4_ + 1.0;
            auVar186._8_4_ = auVar126._8_4_ + 1.0;
            auVar186._12_4_ = auVar126._12_4_ + 1.0;
            auVar194._0_4_ = (int)auVar130._0_4_;
            auVar194._4_4_ = (int)auVar130._4_4_;
            auVar194._8_4_ = (int)auVar130._8_4_;
            auVar194._12_4_ = (int)auVar130._12_4_;
            auVar126 = vpslld_avx(auVar194,0x17);
            auVar126 = vpaddd_avx(auVar235,auVar126);
            auVar126 = vfmadd213ps_fma(auVar126,auVar186,auVar109);
            uVar13 = vcmpps_avx512vl(auVar126,auVar183,2);
            auVar125._8_4_ = 0x800000;
            auVar125._0_8_ = 0x80000000800000;
            auVar125._12_4_ = 0x800000;
            auVar126 = vmaxps_avx512vl(auVar126,auVar125);
            auVar124 = vpsrld_avx(auVar126,0x17);
            auVar212._8_4_ = 0x807fffff;
            auVar212._0_8_ = 0x807fffff807fffff;
            auVar212._12_4_ = 0x807fffff;
            auVar127._8_4_ = 0x3f000000;
            auVar127._0_8_ = 0x3f0000003f000000;
            auVar127._12_4_ = 0x3f000000;
            auVar126 = vpternlogd_avx512vl(auVar126,auVar212,auVar127,0xea);
            auVar129._8_4_ = 0x3f3504f3;
            auVar129._0_8_ = 0x3f3504f33f3504f3;
            auVar129._12_4_ = 0x3f3504f3;
            uVar14 = vcmpps_avx512vl(auVar126,auVar129,1);
            auVar29._8_4_ = 0xbf800000;
            auVar29._0_8_ = 0xbf800000bf800000;
            auVar29._12_4_ = 0xbf800000;
            auVar122 = vaddps_avx512vl(auVar126,auVar29);
            auVar126 = vaddps_avx512vl(auVar122,auVar126);
            bVar11 = (bool)((byte)uVar14 & 1);
            auVar131._0_4_ = (float)((uint)bVar11 * auVar126._0_4_ | (uint)!bVar11 * auVar122._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
            auVar131._4_4_ = (float)((uint)bVar11 * auVar126._4_4_ | (uint)!bVar11 * auVar122._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
            auVar131._8_4_ = (float)((uint)bVar11 * auVar126._8_4_ | (uint)!bVar11 * auVar122._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
            auVar131._12_4_ =
                 (float)((uint)bVar11 * auVar126._12_4_ | (uint)!bVar11 * auVar122._12_4_);
            auVar187._0_4_ = auVar131._0_4_ * auVar131._0_4_;
            auVar187._4_4_ = auVar131._4_4_ * auVar131._4_4_;
            auVar187._8_4_ = auVar131._8_4_ * auVar131._8_4_;
            auVar187._12_4_ = auVar131._12_4_ * auVar131._12_4_;
            auVar30._8_4_ = 0xbdebd1b8;
            auVar30._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar30._12_4_ = 0xbdebd1b8;
            auVar126 = vfmadd213ps_avx512vl(auVar101,auVar131,auVar30);
            auVar31._8_4_ = 0x3def251a;
            auVar31._0_8_ = 0x3def251a3def251a;
            auVar31._12_4_ = 0x3def251a;
            auVar126 = vfmadd213ps_avx512vl(auVar126,auVar131,auVar31);
            auVar126 = vfmadd213ps_avx512vl(auVar126,auVar131,auVar102);
            auVar126 = vfmadd213ps_avx512vl(auVar126,auVar131,auVar103);
            auVar126 = vfmadd213ps_avx512vl(auVar126,auVar131,auVar104);
            auVar126 = vfmadd213ps_avx512vl(auVar126,auVar131,auVar105);
            auVar126 = vfmadd213ps_avx512vl(auVar126,auVar131,auVar106);
            auVar126 = vfmadd213ps_avx512vl(auVar126,auVar131,auVar107);
            auVar122 = vmulps_avx512vl(auVar187,auVar131);
            auVar170 = ZEXT1664(auVar122);
            auVar122 = vmulps_avx512vl(auVar122,auVar126);
            auVar32._8_4_ = 0xffffff82;
            auVar32._0_8_ = 0xffffff82ffffff82;
            auVar32._12_4_ = 0xffffff82;
            auVar126 = vpaddd_avx512vl(auVar124,auVar32);
            auVar126 = vcvtdq2ps_avx(auVar126);
            auVar124 = vsubps_avx512vl(auVar126,auVar109);
            bVar11 = (bool)((byte)uVar14 & 1);
            auVar132._0_4_ = (uint)bVar11 * auVar124._0_4_ | (uint)!bVar11 * auVar126._0_4_;
            bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
            auVar132._4_4_ = (uint)bVar11 * auVar124._4_4_ | (uint)!bVar11 * auVar126._4_4_;
            bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
            auVar132._8_4_ = (uint)bVar11 * auVar124._8_4_ | (uint)!bVar11 * auVar126._8_4_;
            bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
            auVar132._12_4_ = (uint)bVar11 * auVar124._12_4_ | (uint)!bVar11 * auVar126._12_4_;
            auVar126 = vfmadd231ps_fma(auVar122,auVar132,auVar239);
            auVar126 = vfmsub231ps_fma(auVar126,auVar112,auVar187);
            auVar126 = vsubps_avx(auVar126,auVar131);
            auVar126 = vfnmadd231ps_fma(auVar126,auVar110,auVar132);
            auVar122 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar133._0_4_ =
                 (uint)bVar11 * auVar122._0_4_ |
                 (uint)!bVar11 * (int)(auVar126._0_4_ + auVar126._0_4_);
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar133._4_4_ =
                 (uint)bVar11 * auVar122._4_4_ |
                 (uint)!bVar11 * (int)(auVar126._4_4_ + auVar126._4_4_);
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar133._8_4_ =
                 (uint)bVar11 * auVar122._8_4_ |
                 (uint)!bVar11 * (int)(auVar126._8_4_ + auVar126._8_4_);
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar133._12_4_ =
                 (uint)bVar11 * auVar122._12_4_ |
                 (uint)!bVar11 * (int)(auVar126._12_4_ + auVar126._12_4_);
            auVar126 = vminps_avx512vl(auVar133,auVar100);
            auVar124 = vmaxps_avx512vl(auVar126,auVar120);
            auVar122 = vfmadd213ps_fma(auVar108,auVar124,auVar112);
            auVar213._0_4_ = (int)auVar122._0_4_;
            auVar213._4_4_ = (int)auVar122._4_4_;
            auVar213._8_4_ = (int)auVar122._8_4_;
            auVar213._12_4_ = (int)auVar122._12_4_;
            auVar126 = vcvtdq2ps_avx(auVar213);
            uVar13 = vcmpps_avx512vl(auVar122,auVar126,1);
            auVar122 = vsubps_avx512vl(auVar126,auVar109);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar134._0_4_ = (float)((uint)bVar11 * auVar122._0_4_ | (uint)!bVar11 * auVar126._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar134._4_4_ = (float)((uint)bVar11 * auVar122._4_4_ | (uint)!bVar11 * auVar126._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar134._8_4_ = (float)((uint)bVar11 * auVar122._8_4_ | (uint)!bVar11 * auVar126._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar134._12_4_ =
                 (float)((uint)bVar11 * auVar122._12_4_ | (uint)!bVar11 * auVar126._12_4_);
            auVar126 = vfmsub231ps_fma(auVar124,auVar134,auVar110);
            auVar122 = vfnmsub231ps_fma(auVar126,auVar134,auVar239);
            auVar195._0_4_ = auVar122._0_4_ * auVar122._0_4_;
            auVar195._4_4_ = auVar122._4_4_ * auVar122._4_4_;
            auVar195._8_4_ = auVar122._8_4_ * auVar122._8_4_;
            auVar195._12_4_ = auVar122._12_4_ * auVar122._12_4_;
            auVar126 = vfmadd213ps_fma(auVar111,auVar122,auVar222);
            auVar126 = vfmadd213ps_fma(auVar126,auVar122,auVar225);
            auVar126 = vfmadd213ps_fma(auVar126,auVar122,auVar228);
            auVar126 = vfmadd213ps_fma(auVar126,auVar122,auVar231);
            auVar126 = vfmadd213ps_fma(auVar126,auVar122,auVar112);
            auVar126 = vfmadd213ps_fma(auVar126,auVar195,auVar122);
            auVar196._0_4_ = auVar126._0_4_ + 1.0;
            auVar196._4_4_ = auVar126._4_4_ + 1.0;
            auVar196._8_4_ = auVar126._8_4_ + 1.0;
            auVar196._12_4_ = auVar126._12_4_ + 1.0;
            auVar188._0_4_ = (int)auVar134._0_4_;
            auVar188._4_4_ = (int)auVar134._4_4_;
            auVar188._8_4_ = (int)auVar134._8_4_;
            auVar188._12_4_ = (int)auVar134._12_4_;
            auVar126 = vpslld_avx(auVar188,0x17);
            auVar126 = vpaddd_avx(auVar235,auVar126);
            auVar122 = vfmadd213ps_fma(auVar126,auVar196,auVar109);
            auVar126 = vrcpps_avx(auVar122);
            auVar214._0_4_ = auVar126._0_4_ + auVar126._0_4_;
            auVar214._4_4_ = auVar126._4_4_ + auVar126._4_4_;
            auVar214._8_4_ = auVar126._8_4_ + auVar126._8_4_;
            auVar214._12_4_ = auVar126._12_4_ + auVar126._12_4_;
            auVar122 = vfmsub213ps_avx512vl(auVar122,auVar214,auVar121);
            auVar126 = vfnmadd213ps_fma(auVar122,auVar126,auVar214);
            auVar126 = vfmsub213ps_avx512vl(auVar126,auVar123,auVar123);
            break;
          case 6:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var4);
            auVar122._4_4_ = uVar1;
            auVar122._0_4_ = uVar1;
            auVar122._8_4_ = uVar1;
            auVar122._12_4_ = uVar1;
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var4))[1];
            auVar126._4_4_ = uVar1;
            auVar126._0_4_ = uVar1;
            auVar126._8_4_ = uVar1;
            auVar126._12_4_ = uVar1;
            auVar126 = vfmadd213ps_avx512vl(auVar122,auVar123,auVar126);
            auVar126 = vmaxps_avx(auVar126,auVar183);
            auVar126 = vminps_avx(auVar126,auVar109);
            auVar126 = vmulps_avx512vl(auVar126,auVar123);
          }
        }
        *(undefined1 (*) [16])((long)top_blob->data + lVar96 * 4) = auVar126;
        lVar89 = lVar89 + lVar91;
        lVar90 = lVar90 + lVar91;
        lVar95 = lVar95 + lVar91;
        local_120 = local_120 + lVar91;
      }
      pvVar7 = (this->weight_data_tm).data;
      pfVar9 = *(float **)(&this->field_0xe8 + (long)p_Var4);
      pvVar10 = top_blob->data;
      local_140 = 0;
      for (lVar89 = (long)(int)((int)uVar98 + uVar82 * 4); lVar89 < (int)uVar3; lVar89 = lVar89 + 1)
      {
        if (lVar6 == 0) {
          auVar170 = ZEXT1664(ZEXT816(0) << 0x40);
        }
        else {
          auVar170 = ZEXT464(*(uint *)(lVar6 + lVar89 * 4));
        }
        pauVar84 = (undefined1 (*) [32])((long)pvVar7 + lVar89 * lVar94 * 4);
        auVar100 = ZEXT816(0) << 0x40;
        pauVar87 = pauVar93;
        for (iVar92 = 0; iVar92 + 7 < iVar88; iVar92 = iVar92 + 8) {
          auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),*pauVar87,*pauVar84);
          pauVar87 = pauVar87 + 1;
          pauVar84 = pauVar84 + 1;
        }
        auVar120 = ZEXT816(0) << 0x40;
        for (; iVar92 + 3 < iVar88; iVar92 = iVar92 + 4) {
          auVar120 = vfmadd231ps_fma(auVar120,*(undefined1 (*) [16])*pauVar87,
                                     *(undefined1 (*) [16])*pauVar84);
          pauVar87 = (undefined1 (*) [32])(*pauVar87 + 0x10);
          pauVar84 = (undefined1 (*) [32])(*pauVar84 + 0x10);
        }
        lVar90 = 0;
        for (; iVar92 < iVar88; iVar92 = iVar92 + 1) {
          auVar101 = vfmadd231ss_fma(auVar170._0_16_,ZEXT416(*(uint *)(*pauVar84 + lVar90)),
                                     ZEXT416(*(uint *)(*pauVar87 + lVar90)));
          auVar170 = ZEXT1664(auVar101);
          lVar90 = lVar90 + 4;
        }
        auVar101._0_4_ = auVar100._0_4_ + auVar120._0_4_ + 0.0;
        auVar101._4_4_ = auVar100._4_4_ + auVar120._4_4_ + 0.0;
        auVar101._8_4_ = auVar100._8_4_ + auVar120._8_4_ + 0.0;
        auVar101._12_4_ = auVar100._12_4_ + auVar120._12_4_ + 0.0;
        auVar100 = vhaddps_avx(auVar101,auVar101);
        auVar100 = vhaddps_avx(auVar100,auVar100);
        fVar219 = auVar100._0_4_ + auVar170._0_4_;
        auVar100 = ZEXT416((uint)fVar219);
        fVar181 = fVar219;
        switch(iVar81) {
        case 1:
          auVar100 = vmaxss_avx(auVar100,ZEXT416(0));
          fVar181 = auVar100._0_4_;
          break;
        case 2:
          uVar15 = vcmpss_avx512f(auVar100,ZEXT416(0),0xe);
          bVar11 = (bool)((byte)uVar15 & 1);
          fVar181 = (float)((uint)bVar11 * 0x3f800000 + (uint)!bVar11 * (int)*pfVar9) * fVar219;
          break;
        case 3:
          auVar100 = vmaxss_avx(auVar100,ZEXT416((uint)*pfVar9));
          fVar181 = auVar100._0_4_;
          if (pfVar9[1] < auVar100._0_4_) {
            fVar181 = pfVar9[1];
          }
          break;
        case 4:
          auVar100 = vminss_avx(auVar100,SUB6416(ZEXT464(0x42b0c0a5),0));
          auVar102._8_4_ = 0x80000000;
          auVar102._0_8_ = 0x8000000080000000;
          auVar102._12_4_ = 0x80000000;
          auVar120 = vxorps_avx512vl(auVar100,auVar102);
          uVar15 = vcmpss_avx512f(auVar100,ZEXT416(0xc2b0c0a5),1);
          bVar11 = (bool)((byte)uVar15 & 1);
          fVar219 = expf((float)((uint)bVar11 * 0x42b0c0a5 + (uint)!bVar11 * auVar120._0_4_));
          fVar181 = 1.0 / (fVar219 + 1.0);
          break;
        case 5:
          fVar181 = expf(fVar219);
          fVar181 = logf(fVar181 + 1.0);
          fVar181 = tanhf(fVar181);
          fVar181 = fVar181 * fVar219;
          break;
        case 6:
          fVar2 = *pfVar9;
          auVar120._8_4_ = 0x80000000;
          auVar120._0_8_ = 0x8000000080000000;
          auVar120._12_4_ = 0x80000000;
          auVar120 = vxorps_avx512vl(ZEXT416((uint)pfVar9[1]),auVar120);
          fVar202 = auVar120._0_4_ / fVar2;
          fVar181 = 0.0;
          if ((fVar202 <= fVar219) && (fVar181 = fVar219, fVar219 <= fVar202 + 1.0 / fVar2)) {
            auVar100 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar100,ZEXT416((uint)pfVar9[1]));
            fVar181 = auVar100._0_4_ * fVar219;
          }
        }
        *(float *)((long)pvVar10 + lVar89 * 4) = fVar181;
      }
    }
    else if (iVar92 == 4) {
      local_140 = 0;
      uVar83 = 0;
      if (0 < (int)uVar3) {
        uVar83 = uVar98;
      }
      auVar121._8_4_ = 0x42b0c0a5;
      auVar121._0_8_ = 0x42b0c0a542b0c0a5;
      auVar121._12_4_ = 0x42b0c0a5;
      auVar183._8_4_ = 0xc2b0c0a5;
      auVar183._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar183._12_4_ = 0xc2b0c0a5;
      auVar203._8_4_ = 0x3f000000;
      auVar203._0_8_ = 0x3f0000003f000000;
      auVar203._12_4_ = 0x3f000000;
      auVar204._8_4_ = 0x3fb8aa3b;
      auVar204._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar204._12_4_ = 0x3fb8aa3b;
      auVar206._8_4_ = 0x3f800000;
      auVar206._0_8_ = 0x3f8000003f800000;
      auVar206._12_4_ = 0x3f800000;
      auVar207._8_4_ = 0x3f318000;
      auVar207._0_8_ = 0x3f3180003f318000;
      auVar207._12_4_ = 0x3f318000;
      auVar220._8_4_ = 0x39506967;
      auVar220._0_8_ = 0x3950696739506967;
      auVar220._12_4_ = 0x39506967;
      auVar221._8_4_ = 0x3ab743ce;
      auVar221._0_8_ = 0x3ab743ce3ab743ce;
      auVar221._12_4_ = 0x3ab743ce;
      auVar224._8_4_ = 0x3c088908;
      auVar224._0_8_ = 0x3c0889083c088908;
      auVar224._12_4_ = 0x3c088908;
      auVar227._8_4_ = 0x3d2aa9c1;
      auVar227._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar227._12_4_ = 0x3d2aa9c1;
      auVar230._8_4_ = 0x3e2aaaaa;
      auVar230._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar230._12_4_ = 0x3e2aaaaa;
      auVar234._8_4_ = 0x3f800000;
      auVar234._0_8_ = 0x3f8000003f800000;
      auVar234._12_4_ = 0x3f800000;
      auVar238._8_4_ = 0xb95e8083;
      auVar238._0_8_ = 0xb95e8083b95e8083;
      auVar238._12_4_ = 0xb95e8083;
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar103 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar105 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar100 = vxorps_avx512vl(auVar100,auVar100);
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      for (uVar98 = 0; uVar98 != uVar83; uVar98 = uVar98 + 1) {
        if (lVar6 == 0) {
          auVar112 = ZEXT816(0) << 0x40;
        }
        else {
          auVar112 = *(undefined1 (*) [16])(lVar6 + uVar98 * 0x10);
        }
        pvVar7 = (this->weight_data_tm).data;
        sVar8 = (this->weight_data_tm).elemsize;
        lVar89 = (long)(this->weight_data_tm).w;
        pauVar84 = (undefined1 (*) [32])(uVar98 * lVar89 * sVar8 + (long)pvVar7);
        lVar90 = 0;
        auVar170 = ZEXT1664(ZEXT816(0) << 0x40);
        lVar94 = 0;
        auVar171 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar108 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
        in_ZMM16 = ZEXT1664(auVar108);
        auVar108 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
        in_ZMM17 = ZEXT1664(auVar108);
        iVar92 = 0;
        pauVar93 = local_c8;
        while( true ) {
          if (iVar88 <= iVar92 + 7) break;
          auVar108 = vbroadcastss_avx512vl(ZEXT416(*(uint *)*pauVar93));
          auVar109 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar93 + 4)));
          auVar136 = vinsertf32x4_avx512vl(ZEXT1632(auVar108),auVar109,1);
          auVar108 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar93 + 8)));
          auVar109 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar93 + 0xc)));
          auVar110 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar93 + 0x10)));
          auVar111 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar93 + 0x14)));
          auVar137 = vinsertf32x4_avx512vl(ZEXT1632(auVar108),auVar109,1);
          auVar138 = vinsertf32x4_avx512vl(ZEXT1632(auVar110),auVar111,1);
          auVar108 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar93 + 0x18)));
          auVar109 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar93 + 0x1c)));
          auVar136 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar136,*pauVar84);
          in_ZMM17 = ZEXT3264(auVar136);
          auVar136 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,auVar137,pauVar84[1]);
          in_ZMM16 = ZEXT3264(auVar136);
          auVar136 = vfmadd231ps_avx512vl(auVar171._0_32_,auVar138,pauVar84[2]);
          auVar171 = ZEXT3264(auVar136);
          auVar136 = vinsertf32x4_avx512vl(ZEXT1632(auVar108),auVar109,1);
          auVar136 = vfmadd231ps_avx512vl(auVar170._0_32_,auVar136,pauVar84[3]);
          auVar170 = ZEXT3264(auVar136);
          pauVar93 = pauVar93 + 1;
          pauVar84 = pauVar84 + 4;
          iVar92 = iVar92 + 8;
          lVar94 = lVar94 + 0x20;
          lVar90 = lVar90 + 8;
        }
        lVar89 = sVar8 * uVar98 * lVar89;
        while( true ) {
          if (iVar88 <= iVar92 + 3) break;
          auVar108 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*local_c8 + lVar94 + 4)));
          auVar109 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*local_c8 + lVar94)));
          auVar110 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*local_c8 + lVar94 + 0xc)));
          auVar136 = vinsertf32x4_avx512vl(ZEXT1632(auVar109),auVar108,1);
          auVar108 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*local_c8 + lVar94 + 8)));
          auVar137 = vinsertf32x4_avx512vl(ZEXT1632(auVar108),auVar110,1);
          auVar136 = vfmadd231ps_avx512vl
                               (in_ZMM17._0_32_,auVar136,
                                *(undefined1 (*) [32])((long)pvVar7 + lVar94 * 4 + lVar89));
          in_ZMM17 = ZEXT3264(auVar136);
          auVar136 = vfmadd231ps_avx512vl
                               (in_ZMM16._0_32_,auVar137,
                                *(undefined1 (*) [32])((long)pvVar7 + lVar94 * 4 + lVar89 + 0x20));
          in_ZMM16 = ZEXT3264(auVar136);
          pauVar84 = pauVar84 + 2;
          iVar92 = iVar92 + 4;
          lVar94 = lVar94 + 0x10;
          lVar90 = lVar90 + 4;
        }
        for (; (int)lVar90 < iVar88; lVar90 = lVar90 + 1) {
          auVar108 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*local_c8 + lVar90 * 4)));
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar108,*(undefined1 (*) [16])*pauVar84);
          pauVar84 = (undefined1 (*) [32])(*pauVar84 + 0x10);
        }
        auVar136 = vaddps_avx512vl(in_ZMM16._0_32_,in_ZMM17._0_32_);
        fVar219 = auVar136._4_4_ + auVar171._4_4_ + auVar170._4_4_;
        auVar182._0_4_ =
             auVar136._16_4_ + auVar171._16_4_ + auVar170._16_4_ +
             auVar136._0_4_ + auVar171._0_4_ + auVar170._0_4_ + auVar112._0_4_;
        auVar182._4_4_ = fVar219 + fVar219 + auVar112._4_4_;
        auVar182._8_4_ =
             auVar136._24_4_ + auVar171._24_4_ + auVar170._24_4_ +
             auVar136._8_4_ + auVar171._8_4_ + auVar170._8_4_ + auVar112._8_4_;
        auVar182._12_4_ =
             auVar136._28_4_ + auVar171._28_4_ + auVar170._28_4_ +
             auVar136._12_4_ + auVar171._12_4_ + auVar170._12_4_ + auVar112._12_4_;
        auVar113 = auVar182;
        if (iVar81 - 1U < 6) {
          auVar113 = vmaxps_avx512vl(auVar182,auVar100);
          switch(iVar81) {
          case 2:
            auVar112 = vminps_avx512vl(auVar182,auVar100);
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var4);
            auVar28._4_4_ = uVar1;
            auVar28._0_4_ = uVar1;
            auVar28._8_4_ = uVar1;
            auVar28._12_4_ = uVar1;
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar112,auVar28);
            break;
          case 3:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var4);
            auVar26._4_4_ = uVar1;
            auVar26._0_4_ = uVar1;
            auVar26._8_4_ = uVar1;
            auVar26._12_4_ = uVar1;
            auVar112 = vmaxps_avx512vl(auVar182,auVar26);
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var4))[1];
            auVar27._4_4_ = uVar1;
            auVar27._0_4_ = uVar1;
            auVar27._8_4_ = uVar1;
            auVar27._12_4_ = uVar1;
            auVar113 = vminps_avx512vl(auVar112,auVar27);
            break;
          case 4:
            auVar24._8_4_ = 0x80000000;
            auVar24._0_8_ = 0x8000000080000000;
            auVar24._12_4_ = 0x80000000;
            auVar112 = vxorps_avx512vl(auVar182,auVar24);
            auVar112 = vminps_avx(auVar112,auVar121);
            auVar108 = vmaxps_avx(auVar112,auVar183);
            auVar109 = vfmadd231ps_fma(auVar203,auVar108,auVar204);
            auVar244._0_4_ = (int)auVar109._0_4_;
            auVar244._4_4_ = (int)auVar109._4_4_;
            auVar244._8_4_ = (int)auVar109._8_4_;
            auVar244._12_4_ = (int)auVar109._12_4_;
            auVar112 = vcvtdq2ps_avx(auVar244);
            uVar13 = vcmpps_avx512vl(auVar109,auVar112,1);
            auVar109 = vsubps_avx512vl(auVar112,auVar206);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar119._0_4_ = (float)((uint)bVar11 * auVar109._0_4_ | (uint)!bVar11 * auVar112._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar119._4_4_ = (float)((uint)bVar11 * auVar109._4_4_ | (uint)!bVar11 * auVar112._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar119._8_4_ = (float)((uint)bVar11 * auVar109._8_4_ | (uint)!bVar11 * auVar112._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar119._12_4_ =
                 (float)((uint)bVar11 * auVar109._12_4_ | (uint)!bVar11 * auVar112._12_4_);
            auVar112 = vfmsub231ps_fma(auVar108,auVar119,auVar207);
            auVar25._8_4_ = 0x395e8083;
            auVar25._0_8_ = 0x395e8083395e8083;
            auVar25._12_4_ = 0x395e8083;
            auVar112 = vfmsub231ps_avx512vl(auVar112,auVar119,auVar25);
            auVar208._0_4_ = auVar112._0_4_ * auVar112._0_4_;
            auVar208._4_4_ = auVar112._4_4_ * auVar112._4_4_;
            auVar208._8_4_ = auVar112._8_4_ * auVar112._8_4_;
            auVar208._12_4_ = auVar112._12_4_ * auVar112._12_4_;
            auVar108 = vfmadd213ps_avx512vl(auVar220,auVar112,auVar221);
            auVar108 = vfmadd213ps_avx512vl(auVar108,auVar112,auVar224);
            auVar108 = vfmadd213ps_avx512vl(auVar108,auVar112,auVar227);
            auVar108 = vfmadd213ps_avx512vl(auVar108,auVar112,auVar230);
            auVar108 = vfmadd213ps_avx512vl(auVar108,auVar112,auVar203);
            auVar112 = vfmadd213ps_avx512vl(auVar108,auVar208,auVar112);
            in_ZMM16 = ZEXT1664(auVar112);
            auVar108 = vaddps_avx512vl(auVar112,auVar206);
            auVar209._0_4_ = (int)auVar119._0_4_;
            auVar209._4_4_ = (int)auVar119._4_4_;
            auVar209._8_4_ = (int)auVar119._8_4_;
            auVar209._12_4_ = (int)auVar119._12_4_;
            auVar112 = vpslld_avx(auVar209,0x17);
            auVar112 = vpaddd_avx(auVar234,auVar112);
            auVar108 = vfmadd213ps_fma(auVar112,auVar108,auVar206);
            auVar112 = vrcpps_avx(auVar108);
            auVar108 = vfmsub213ps_fma(auVar108,auVar112,auVar206);
            auVar113 = vfnmadd132ps_fma(auVar108,auVar112,auVar112);
            break;
          case 5:
            auVar112 = vminps_avx(auVar182,auVar121);
            auVar112 = vmaxps_avx(auVar112,auVar183);
            auVar108 = vfmadd213ps_fma(auVar204,auVar112,auVar203);
            auVar109 = vcvttps2dq_avx512vl(auVar108);
            auVar109 = vcvtdq2ps_avx512vl(auVar109);
            uVar13 = vcmpps_avx512vl(auVar108,auVar109,1);
            auVar108 = vsubps_avx512vl(auVar109,auVar206);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar114._0_4_ = (uint)bVar11 * auVar108._0_4_ | (uint)!bVar11 * auVar109._0_4_;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar114._4_4_ = (uint)bVar11 * auVar108._4_4_ | (uint)!bVar11 * auVar109._4_4_;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar114._8_4_ = (uint)bVar11 * auVar108._8_4_ | (uint)!bVar11 * auVar109._8_4_;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar114._12_4_ = (uint)bVar11 * auVar108._12_4_ | (uint)!bVar11 * auVar109._12_4_;
            auVar112 = vfmsub231ps_avx512vl(auVar112,auVar114,auVar207);
            auVar112 = vfnmsub231ps_avx512vl(auVar112,auVar114,auVar238);
            auVar242._0_4_ = auVar112._0_4_ * auVar112._0_4_;
            auVar242._4_4_ = auVar112._4_4_ * auVar112._4_4_;
            auVar242._8_4_ = auVar112._8_4_ * auVar112._8_4_;
            auVar242._12_4_ = auVar112._12_4_ * auVar112._12_4_;
            auVar108 = vfmadd213ps_avx512vl(auVar220,auVar112,auVar221);
            auVar108 = vfmadd213ps_avx512vl(auVar108,auVar112,auVar224);
            auVar108 = vfmadd213ps_avx512vl(auVar108,auVar112,auVar227);
            auVar108 = vfmadd213ps_avx512vl(auVar108,auVar112,auVar230);
            auVar108 = vfmadd213ps_avx512vl(auVar108,auVar112,auVar203);
            auVar112 = vfmadd213ps_avx512vl(auVar108,auVar242,auVar112);
            auVar108 = vaddps_avx512vl(auVar112,auVar206);
            auVar112 = vcvttps2dq_avx512vl(auVar114);
            auVar112 = vpslld_avx(auVar112,0x17);
            auVar112 = vpaddd_avx(auVar112,auVar234);
            auVar112 = vfmadd213ps_fma(auVar112,auVar108,auVar206);
            uVar13 = vcmpps_avx512vl(auVar112,auVar100,2);
            auVar17._8_4_ = 0x800000;
            auVar17._0_8_ = 0x80000000800000;
            auVar17._12_4_ = 0x800000;
            auVar112 = vmaxps_avx512vl(auVar112,auVar17);
            auVar110 = vpsrld_avx(auVar112,0x17);
            auVar108 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
            auVar18._8_4_ = 0x3f000000;
            auVar18._0_8_ = 0x3f0000003f000000;
            auVar18._12_4_ = 0x3f000000;
            auVar112 = vpternlogd_avx512vl(auVar112,auVar108,auVar18,0xea);
            auVar19._8_4_ = 0x3f3504f3;
            auVar19._0_8_ = 0x3f3504f33f3504f3;
            auVar19._12_4_ = 0x3f3504f3;
            uVar14 = vcmpps_avx512vl(auVar112,auVar19,1);
            auVar20._8_4_ = 0xbf800000;
            auVar20._0_8_ = 0xbf800000bf800000;
            auVar20._12_4_ = 0xbf800000;
            auVar108 = vaddps_avx512vl(auVar112,auVar20);
            auVar112 = vaddps_avx512vl(auVar108,auVar112);
            bVar11 = (bool)((byte)uVar14 & 1);
            auVar115._0_4_ = (uint)bVar11 * auVar112._0_4_ | (uint)!bVar11 * auVar108._0_4_;
            bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
            auVar115._4_4_ = (uint)bVar11 * auVar112._4_4_ | (uint)!bVar11 * auVar108._4_4_;
            bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
            auVar115._8_4_ = (uint)bVar11 * auVar112._8_4_ | (uint)!bVar11 * auVar108._8_4_;
            bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
            auVar115._12_4_ = (uint)bVar11 * auVar112._12_4_ | (uint)!bVar11 * auVar108._12_4_;
            auVar108 = vmulps_avx512vl(auVar115,auVar115);
            auVar21._8_4_ = 0xbdebd1b8;
            auVar21._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar21._12_4_ = 0xbdebd1b8;
            auVar112 = vfmadd213ps_avx512vl(auVar120,auVar115,auVar21);
            auVar22._8_4_ = 0x3def251a;
            auVar22._0_8_ = 0x3def251a3def251a;
            auVar22._12_4_ = 0x3def251a;
            auVar112 = vfmadd213ps_avx512vl(auVar112,auVar115,auVar22);
            auVar112 = vfmadd213ps_avx512vl(auVar112,auVar115,auVar101);
            auVar112 = vfmadd213ps_avx512vl(auVar112,auVar115,auVar102);
            auVar112 = vfmadd213ps_avx512vl(auVar112,auVar115,auVar103);
            auVar112 = vfmadd213ps_avx512vl(auVar112,auVar115,auVar104);
            auVar112 = vfmadd213ps_avx512vl(auVar112,auVar115,auVar105);
            auVar112 = vfmadd213ps_avx512vl(auVar112,auVar115,auVar106);
            auVar109 = vmulps_avx512vl(auVar108,auVar115);
            auVar109 = vmulps_avx512vl(auVar109,auVar112);
            auVar23._8_4_ = 0xffffff82;
            auVar23._0_8_ = 0xffffff82ffffff82;
            auVar23._12_4_ = 0xffffff82;
            auVar112 = vpaddd_avx512vl(auVar110,auVar23);
            auVar112 = vcvtdq2ps_avx(auVar112);
            auVar110 = vsubps_avx512vl(auVar112,auVar206);
            bVar11 = (bool)((byte)uVar14 & 1);
            auVar116._0_4_ = (uint)bVar11 * auVar110._0_4_ | (uint)!bVar11 * auVar112._0_4_;
            bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
            auVar116._4_4_ = (uint)bVar11 * auVar110._4_4_ | (uint)!bVar11 * auVar112._4_4_;
            bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
            auVar116._8_4_ = (uint)bVar11 * auVar110._8_4_ | (uint)!bVar11 * auVar112._8_4_;
            bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
            auVar116._12_4_ = (uint)bVar11 * auVar110._12_4_ | (uint)!bVar11 * auVar112._12_4_;
            auVar112 = vfmadd231ps_avx512vl(auVar109,auVar116,auVar238);
            auVar112 = vfmsub231ps_avx512vl(auVar112,auVar203,auVar108);
            auVar112 = vsubps_avx512vl(auVar112,auVar115);
            auVar112 = vfnmadd231ps_fma(auVar112,auVar207,auVar116);
            auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar117._0_4_ =
                 (uint)bVar11 * auVar108._0_4_ |
                 (uint)!bVar11 * (int)(auVar112._0_4_ + auVar112._0_4_);
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar117._4_4_ =
                 (uint)bVar11 * auVar108._4_4_ |
                 (uint)!bVar11 * (int)(auVar112._4_4_ + auVar112._4_4_);
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar117._8_4_ =
                 (uint)bVar11 * auVar108._8_4_ |
                 (uint)!bVar11 * (int)(auVar112._8_4_ + auVar112._8_4_);
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar117._12_4_ =
                 (uint)bVar11 * auVar108._12_4_ |
                 (uint)!bVar11 * (int)(auVar112._12_4_ + auVar112._12_4_);
            auVar112 = vminps_avx(auVar117,auVar121);
            auVar112 = vmaxps_avx(auVar112,auVar183);
            auVar108 = vfmadd213ps_fma(auVar204,auVar112,auVar203);
            auVar109 = vcvttps2dq_avx512vl(auVar108);
            auVar109 = vcvtdq2ps_avx512vl(auVar109);
            uVar13 = vcmpps_avx512vl(auVar108,auVar109,1);
            auVar108 = vsubps_avx512vl(auVar109,auVar206);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar118._0_4_ = (uint)bVar11 * auVar108._0_4_ | (uint)!bVar11 * auVar109._0_4_;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar118._4_4_ = (uint)bVar11 * auVar108._4_4_ | (uint)!bVar11 * auVar109._4_4_;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar118._8_4_ = (uint)bVar11 * auVar108._8_4_ | (uint)!bVar11 * auVar109._8_4_;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar118._12_4_ = (uint)bVar11 * auVar108._12_4_ | (uint)!bVar11 * auVar109._12_4_;
            auVar112 = vfmsub231ps_avx512vl(auVar112,auVar118,auVar207);
            auVar112 = vfnmsub231ps_avx512vl(auVar112,auVar118,auVar238);
            auVar243._0_4_ = auVar112._0_4_ * auVar112._0_4_;
            auVar243._4_4_ = auVar112._4_4_ * auVar112._4_4_;
            auVar243._8_4_ = auVar112._8_4_ * auVar112._8_4_;
            auVar243._12_4_ = auVar112._12_4_ * auVar112._12_4_;
            auVar108 = vfmadd213ps_avx512vl(auVar220,auVar112,auVar221);
            auVar108 = vfmadd213ps_avx512vl(auVar108,auVar112,auVar224);
            auVar108 = vfmadd213ps_avx512vl(auVar108,auVar112,auVar227);
            auVar108 = vfmadd213ps_avx512vl(auVar108,auVar112,auVar230);
            auVar108 = vfmadd213ps_avx512vl(auVar108,auVar112,auVar203);
            auVar112 = vfmadd213ps_avx512vl(auVar108,auVar243,auVar112);
            in_ZMM17 = ZEXT1664(auVar112);
            auVar108 = vaddps_avx512vl(auVar112,auVar206);
            auVar112 = vcvttps2dq_avx512vl(auVar118);
            auVar112 = vpslld_avx(auVar112,0x17);
            auVar112 = vpaddd_avx(auVar234,auVar112);
            auVar108 = vfmadd213ps_fma(auVar112,auVar108,auVar206);
            auVar112 = vrcpps_avx(auVar108);
            auVar109 = vaddps_avx512vl(auVar112,auVar112);
            in_ZMM16 = ZEXT1664(auVar109);
            auVar108 = vfmsub213ps_avx512vl(auVar108,auVar109,auVar107);
            auVar112 = vfnmadd213ps_avx512vl(auVar108,auVar112,auVar109);
            auVar113 = vfmsub213ps_fma(auVar112,auVar182,auVar182);
            break;
          case 6:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var4);
            auVar210._4_4_ = uVar1;
            auVar210._0_4_ = uVar1;
            auVar210._8_4_ = uVar1;
            auVar210._12_4_ = uVar1;
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var4))[1];
            auVar16._4_4_ = uVar1;
            auVar16._0_4_ = uVar1;
            auVar16._8_4_ = uVar1;
            auVar16._12_4_ = uVar1;
            auVar112 = vfmadd213ps_avx512vl(auVar210,auVar182,auVar16);
            auVar112 = vmaxps_avx512vl(auVar112,auVar100);
            auVar112 = vminps_avx(auVar112,auVar206);
            auVar113._0_4_ = auVar112._0_4_ * auVar182._0_4_;
            auVar113._4_4_ = auVar112._4_4_ * auVar182._4_4_;
            auVar113._8_4_ = auVar112._8_4_ * auVar182._8_4_;
            auVar113._12_4_ = auVar112._12_4_ * auVar182._12_4_;
          }
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar98 * 0x10) = auVar113;
      }
    }
    else if (iVar92 == 8) {
      local_140 = 0;
      if ((int)uVar3 < 1) {
        uVar98 = 0;
      }
      auVar153._8_4_ = 0x42b0c0a5;
      auVar153._0_8_ = 0x42b0c0a542b0c0a5;
      auVar153._12_4_ = 0x42b0c0a5;
      auVar153._16_4_ = 0x42b0c0a5;
      auVar153._20_4_ = 0x42b0c0a5;
      auVar153._24_4_ = 0x42b0c0a5;
      auVar153._28_4_ = 0x42b0c0a5;
      auVar154._8_4_ = 0xc2b0c0a5;
      auVar154._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar154._12_4_ = 0xc2b0c0a5;
      auVar154._16_4_ = 0xc2b0c0a5;
      auVar154._20_4_ = 0xc2b0c0a5;
      auVar154._24_4_ = 0xc2b0c0a5;
      auVar154._28_4_ = 0xc2b0c0a5;
      auVar155._8_4_ = 0x3f000000;
      auVar155._0_8_ = 0x3f0000003f000000;
      auVar155._12_4_ = 0x3f000000;
      auVar155._16_4_ = 0x3f000000;
      auVar155._20_4_ = 0x3f000000;
      auVar155._24_4_ = 0x3f000000;
      auVar155._28_4_ = 0x3f000000;
      auVar156._8_4_ = 0x3fb8aa3b;
      auVar156._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar156._12_4_ = 0x3fb8aa3b;
      auVar156._16_4_ = 0x3fb8aa3b;
      auVar156._20_4_ = 0x3fb8aa3b;
      auVar156._24_4_ = 0x3fb8aa3b;
      auVar156._28_4_ = 0x3fb8aa3b;
      auVar157._8_4_ = 0x3f800000;
      auVar157._0_8_ = 0x3f8000003f800000;
      auVar157._12_4_ = 0x3f800000;
      auVar157._16_4_ = 0x3f800000;
      auVar157._20_4_ = 0x3f800000;
      auVar157._24_4_ = 0x3f800000;
      auVar157._28_4_ = 0x3f800000;
      auVar158._8_4_ = 0x3f318000;
      auVar158._0_8_ = 0x3f3180003f318000;
      auVar158._12_4_ = 0x3f318000;
      auVar158._16_4_ = 0x3f318000;
      auVar158._20_4_ = 0x3f318000;
      auVar158._24_4_ = 0x3f318000;
      auVar158._28_4_ = 0x3f318000;
      auVar159._8_4_ = 0x39506967;
      auVar159._0_8_ = 0x3950696739506967;
      auVar159._12_4_ = 0x39506967;
      auVar159._16_4_ = 0x39506967;
      auVar159._20_4_ = 0x39506967;
      auVar159._24_4_ = 0x39506967;
      auVar159._28_4_ = 0x39506967;
      auVar223._8_4_ = 0x3ab743ce;
      auVar223._0_8_ = 0x3ab743ce3ab743ce;
      auVar223._12_4_ = 0x3ab743ce;
      auVar223._16_4_ = 0x3ab743ce;
      auVar223._20_4_ = 0x3ab743ce;
      auVar223._24_4_ = 0x3ab743ce;
      auVar223._28_4_ = 0x3ab743ce;
      auVar226._8_4_ = 0x3c088908;
      auVar226._0_8_ = 0x3c0889083c088908;
      auVar226._12_4_ = 0x3c088908;
      auVar226._16_4_ = 0x3c088908;
      auVar226._20_4_ = 0x3c088908;
      auVar226._24_4_ = 0x3c088908;
      auVar226._28_4_ = 0x3c088908;
      auVar229._8_4_ = 0x3d2aa9c1;
      auVar229._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar229._12_4_ = 0x3d2aa9c1;
      auVar229._16_4_ = 0x3d2aa9c1;
      auVar229._20_4_ = 0x3d2aa9c1;
      auVar229._24_4_ = 0x3d2aa9c1;
      auVar229._28_4_ = 0x3d2aa9c1;
      auVar232._8_4_ = 0x3e2aaaaa;
      auVar232._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar232._12_4_ = 0x3e2aaaaa;
      auVar232._16_4_ = 0x3e2aaaaa;
      auVar232._20_4_ = 0x3e2aaaaa;
      auVar232._24_4_ = 0x3e2aaaaa;
      auVar232._28_4_ = 0x3e2aaaaa;
      auVar236._8_4_ = 0x3f800000;
      auVar236._0_8_ = 0x3f8000003f800000;
      auVar236._12_4_ = 0x3f800000;
      auVar236._16_4_ = 0x3f800000;
      auVar236._20_4_ = 0x3f800000;
      auVar236._24_4_ = 0x3f800000;
      auVar236._28_4_ = 0x3f800000;
      auVar240._8_4_ = 0xb95e8083;
      auVar240._0_8_ = 0xb95e8083b95e8083;
      auVar240._12_4_ = 0xb95e8083;
      auVar240._16_4_ = 0xb95e8083;
      auVar240._20_4_ = 0xb95e8083;
      auVar240._24_4_ = 0xb95e8083;
      auVar240._28_4_ = 0xb95e8083;
      auVar136 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      auVar137 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar138 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar139 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar140 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar100 = vxorps_avx512vl(auVar100,auVar100);
      auVar141 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
      for (uVar83 = 0; uVar83 != uVar98; uVar83 = uVar83 + 1) {
        auVar171 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar170 = ZEXT1664(ZEXT816(0) << 0x40);
        if (lVar6 != 0) {
          auVar170 = ZEXT3264(*(undefined1 (*) [32])(lVar6 + uVar83 * 0x20));
        }
        pvVar7 = (this->weight_data_tm).data;
        sVar8 = (this->weight_data_tm).elemsize;
        lVar89 = (long)(this->weight_data_tm).w;
        pauVar84 = (undefined1 (*) [32])(uVar83 * lVar89 * sVar8 + (long)pvVar7);
        lVar90 = 0;
        lVar94 = 0;
        auVar172 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar120 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
        in_ZMM16 = ZEXT1664(auVar120);
        auVar120 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
        in_ZMM18 = ZEXT1664(auVar120);
        auVar120 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
        in_ZMM17 = ZEXT1664(auVar120);
        auVar120 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
        in_ZMM19 = ZEXT1664(auVar120);
        auVar120 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
        in_ZMM22 = ZEXT1664(auVar120);
        iVar92 = 0;
        pauVar93 = local_c8;
        while( true ) {
          if (iVar88 <= iVar92 + 7) break;
          auVar142 = vbroadcastss_avx512vl(ZEXT416(*(uint *)*pauVar93));
          auVar143 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar93 + 4)));
          auVar144 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar93 + 8)));
          auVar145 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar93 + 0xc)));
          auVar142 = vfmadd231ps_avx512vl(auVar170._0_32_,auVar142,*pauVar84);
          auVar170 = ZEXT3264(auVar142);
          auVar142 = vfmadd231ps_avx512vl(in_ZMM22._0_32_,auVar143,pauVar84[1]);
          in_ZMM22 = ZEXT3264(auVar142);
          auVar142 = vfmadd231ps_avx512vl(in_ZMM19._0_32_,auVar144,pauVar84[2]);
          in_ZMM19 = ZEXT3264(auVar142);
          auVar142 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar145,pauVar84[3]);
          in_ZMM17 = ZEXT3264(auVar142);
          auVar142 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar93 + 0x10)));
          auVar143 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar93 + 0x14)));
          auVar144 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar93 + 0x18)));
          auVar145 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar93 + 0x1c)));
          auVar142 = vfmadd231ps_avx512vl(in_ZMM18._0_32_,auVar142,pauVar84[4]);
          in_ZMM18 = ZEXT3264(auVar142);
          auVar142 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,auVar143,pauVar84[5]);
          in_ZMM16 = ZEXT3264(auVar142);
          auVar142 = vfmadd231ps_avx512vl(auVar172._0_32_,auVar144,pauVar84[6]);
          auVar172 = ZEXT3264(auVar142);
          auVar142 = vfmadd231ps_avx512vl(auVar171._0_32_,auVar145,pauVar84[7]);
          auVar171 = ZEXT3264(auVar142);
          pauVar93 = pauVar93 + 1;
          pauVar84 = pauVar84 + 8;
          iVar92 = iVar92 + 8;
          lVar94 = lVar94 + 0x20;
          lVar90 = lVar90 + 8;
        }
        lVar89 = sVar8 * uVar83 * lVar89;
        while( true ) {
          if (iVar88 <= iVar92 + 3) break;
          auVar142 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*local_c8 + lVar94)));
          auVar143 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*local_c8 + lVar94 + 4)));
          auVar144 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*local_c8 + lVar94 + 8)));
          auVar145 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*local_c8 + lVar94 + 0xc)));
          auVar142 = vfmadd231ps_avx512vl
                               (auVar170._0_32_,auVar142,
                                *(undefined1 (*) [32])((long)pvVar7 + lVar94 * 8 + lVar89));
          auVar170 = ZEXT3264(auVar142);
          auVar142 = vfmadd231ps_avx512vl
                               (in_ZMM22._0_32_,auVar143,
                                *(undefined1 (*) [32])((long)pvVar7 + lVar94 * 8 + lVar89 + 0x20));
          in_ZMM22 = ZEXT3264(auVar142);
          auVar142 = vfmadd231ps_avx512vl
                               (in_ZMM19._0_32_,auVar144,
                                *(undefined1 (*) [32])((long)pvVar7 + lVar94 * 8 + lVar89 + 0x40));
          in_ZMM19 = ZEXT3264(auVar142);
          auVar142 = vfmadd231ps_avx512vl
                               (in_ZMM17._0_32_,auVar145,
                                *(undefined1 (*) [32])((long)pvVar7 + lVar94 * 8 + lVar89 + 0x60));
          in_ZMM17 = ZEXT3264(auVar142);
          pauVar84 = pauVar84 + 4;
          iVar92 = iVar92 + 4;
          lVar94 = lVar94 + 0x10;
          lVar90 = lVar90 + 4;
        }
        for (; (int)lVar90 < iVar88; lVar90 = lVar90 + 1) {
          auVar142 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*local_c8 + lVar90 * 4)));
          auVar142 = vfmadd231ps_avx512vl(auVar170._0_32_,auVar142,*pauVar84);
          auVar170 = ZEXT3264(auVar142);
          pauVar84 = pauVar84 + 1;
        }
        auVar142 = vaddps_avx512vl(in_ZMM16._0_32_,in_ZMM18._0_32_);
        auVar143 = vaddps_avx512vl(in_ZMM17._0_32_,in_ZMM19._0_32_);
        auVar143 = vaddps_avx512vl(auVar143,in_ZMM22._0_32_);
        auVar184._0_4_ =
             auVar143._0_4_ + auVar142._0_4_ + auVar172._0_4_ + auVar171._0_4_ + auVar170._0_4_;
        auVar184._4_4_ =
             auVar143._4_4_ + auVar142._4_4_ + auVar172._4_4_ + auVar171._4_4_ + auVar170._4_4_;
        auVar184._8_4_ =
             auVar143._8_4_ + auVar142._8_4_ + auVar172._8_4_ + auVar171._8_4_ + auVar170._8_4_;
        auVar184._12_4_ =
             auVar143._12_4_ + auVar142._12_4_ + auVar172._12_4_ + auVar171._12_4_ + auVar170._12_4_
        ;
        auVar184._16_4_ =
             auVar143._16_4_ + auVar142._16_4_ + auVar172._16_4_ + auVar171._16_4_ + auVar170._16_4_
        ;
        auVar184._20_4_ =
             auVar143._20_4_ + auVar142._20_4_ + auVar172._20_4_ + auVar171._20_4_ + auVar170._20_4_
        ;
        auVar184._24_4_ =
             auVar143._24_4_ + auVar142._24_4_ + auVar172._24_4_ + auVar171._24_4_ + auVar170._24_4_
        ;
        auVar184._28_4_ =
             auVar143._28_4_ + auVar142._28_4_ + auVar172._28_4_ + auVar171._28_4_ + auVar170._28_4_
        ;
        auVar146 = auVar184;
        if (iVar81 - 1U < 6) {
          auVar146 = vmaxps_avx512vl(auVar184,ZEXT1632(auVar100));
          switch(iVar81) {
          case 2:
            auVar142 = vminps_avx512vl(auVar184,ZEXT1632(auVar100));
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var4);
            auVar51._4_4_ = uVar1;
            auVar51._0_4_ = uVar1;
            auVar51._8_4_ = uVar1;
            auVar51._12_4_ = uVar1;
            auVar51._16_4_ = uVar1;
            auVar51._20_4_ = uVar1;
            auVar51._24_4_ = uVar1;
            auVar51._28_4_ = uVar1;
            auVar146 = vfmadd231ps_avx512vl(auVar146,auVar142,auVar51);
            break;
          case 3:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var4);
            auVar49._4_4_ = uVar1;
            auVar49._0_4_ = uVar1;
            auVar49._8_4_ = uVar1;
            auVar49._12_4_ = uVar1;
            auVar49._16_4_ = uVar1;
            auVar49._20_4_ = uVar1;
            auVar49._24_4_ = uVar1;
            auVar49._28_4_ = uVar1;
            auVar142 = vmaxps_avx512vl(auVar184,auVar49);
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var4))[1];
            auVar50._4_4_ = uVar1;
            auVar50._0_4_ = uVar1;
            auVar50._8_4_ = uVar1;
            auVar50._12_4_ = uVar1;
            auVar50._16_4_ = uVar1;
            auVar50._20_4_ = uVar1;
            auVar50._24_4_ = uVar1;
            auVar50._28_4_ = uVar1;
            auVar146 = vminps_avx512vl(auVar142,auVar50);
            break;
          case 4:
            auVar47._8_4_ = 0x80000000;
            auVar47._0_8_ = 0x8000000080000000;
            auVar47._12_4_ = 0x80000000;
            auVar47._16_4_ = 0x80000000;
            auVar47._20_4_ = 0x80000000;
            auVar47._24_4_ = 0x80000000;
            auVar47._28_4_ = 0x80000000;
            auVar142 = vxorps_avx512vl(auVar184,auVar47);
            auVar142 = vminps_avx(auVar142,auVar153);
            auVar142 = vmaxps_avx(auVar142,auVar154);
            auVar120 = vfmadd231ps_fma(auVar155,auVar142,auVar156);
            auVar143 = vroundps_avx(ZEXT1632(auVar120),1);
            uVar13 = vcmpps_avx512vl(ZEXT1632(auVar120),auVar143,1);
            auVar144 = vsubps_avx512vl(auVar143,auVar157);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar152._0_4_ = (float)((uint)bVar11 * auVar144._0_4_ | (uint)!bVar11 * auVar143._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar152._4_4_ = (float)((uint)bVar11 * auVar144._4_4_ | (uint)!bVar11 * auVar143._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar152._8_4_ = (float)((uint)bVar11 * auVar144._8_4_ | (uint)!bVar11 * auVar143._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar152._12_4_ =
                 (float)((uint)bVar11 * auVar144._12_4_ | (uint)!bVar11 * auVar143._12_4_);
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            auVar152._16_4_ =
                 (float)((uint)bVar11 * auVar144._16_4_ | (uint)!bVar11 * auVar143._16_4_);
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            auVar152._20_4_ =
                 (float)((uint)bVar11 * auVar144._20_4_ | (uint)!bVar11 * auVar143._20_4_);
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            auVar152._24_4_ =
                 (float)((uint)bVar11 * auVar144._24_4_ | (uint)!bVar11 * auVar143._24_4_);
            bVar11 = SUB81(uVar13 >> 7,0);
            auVar152._28_4_ =
                 (float)((uint)bVar11 * auVar144._28_4_ | (uint)!bVar11 * auVar143._28_4_);
            auVar120 = vfmsub231ps_fma(auVar142,auVar152,auVar158);
            auVar48._8_4_ = 0x395e8083;
            auVar48._0_8_ = 0x395e8083395e8083;
            auVar48._12_4_ = 0x395e8083;
            auVar48._16_4_ = 0x395e8083;
            auVar48._20_4_ = 0x395e8083;
            auVar48._24_4_ = 0x395e8083;
            auVar48._28_4_ = 0x395e8083;
            auVar142 = vfmsub231ps_avx512vl(ZEXT1632(auVar120),auVar152,auVar48);
            auVar216._0_4_ = auVar142._0_4_ * auVar142._0_4_;
            auVar216._4_4_ = auVar142._4_4_ * auVar142._4_4_;
            auVar216._8_4_ = auVar142._8_4_ * auVar142._8_4_;
            auVar216._12_4_ = auVar142._12_4_ * auVar142._12_4_;
            auVar216._16_4_ = auVar142._16_4_ * auVar142._16_4_;
            auVar216._20_4_ = auVar142._20_4_ * auVar142._20_4_;
            auVar216._24_4_ = auVar142._24_4_ * auVar142._24_4_;
            auVar216._28_4_ = 0;
            auVar143 = vfmadd213ps_avx512vl(auVar159,auVar142,auVar223);
            auVar143 = vfmadd213ps_avx512vl(auVar143,auVar142,auVar226);
            auVar143 = vfmadd213ps_avx512vl(auVar143,auVar142,auVar229);
            auVar143 = vfmadd213ps_avx512vl(auVar143,auVar142,auVar232);
            auVar143 = vfmadd213ps_avx512vl(auVar143,auVar142,auVar155);
            auVar142 = vfmadd213ps_avx512vl(auVar143,auVar216,auVar142);
            in_ZMM16 = ZEXT3264(auVar142);
            auVar143 = vaddps_avx512vl(auVar142,auVar157);
            auVar217._0_4_ = (int)auVar152._0_4_;
            auVar217._4_4_ = (int)auVar152._4_4_;
            auVar217._8_4_ = (int)auVar152._8_4_;
            auVar217._12_4_ = (int)auVar152._12_4_;
            auVar217._16_4_ = (int)auVar152._16_4_;
            auVar217._20_4_ = (int)auVar152._20_4_;
            auVar217._24_4_ = (int)auVar152._24_4_;
            auVar217._28_4_ = (int)auVar152._28_4_;
            auVar142 = vpslld_avx2(auVar217,0x17);
            auVar142 = vpaddd_avx2(auVar236,auVar142);
            auVar120 = vfmadd213ps_fma(auVar142,auVar143,auVar157);
            auVar142 = vrcpps_avx(ZEXT1632(auVar120));
            auVar120 = vfmsub213ps_fma(ZEXT1632(auVar120),auVar142,auVar157);
            auVar120 = vfnmadd132ps_fma(ZEXT1632(auVar120),auVar142,auVar142);
            auVar146 = ZEXT1632(auVar120);
            break;
          case 5:
            auVar142 = vminps_avx(auVar184,auVar153);
            auVar142 = vmaxps_avx(auVar142,auVar154);
            auVar120 = vfmadd213ps_fma(auVar156,auVar142,auVar155);
            auVar143 = vrndscaleps_avx512vl(ZEXT1632(auVar120),1);
            uVar13 = vcmpps_avx512vl(ZEXT1632(auVar120),auVar143,1);
            auVar144 = vsubps_avx512vl(auVar143,auVar157);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar147._0_4_ = (uint)bVar11 * auVar144._0_4_ | (uint)!bVar11 * auVar143._0_4_;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar147._4_4_ = (uint)bVar11 * auVar144._4_4_ | (uint)!bVar11 * auVar143._4_4_;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar147._8_4_ = (uint)bVar11 * auVar144._8_4_ | (uint)!bVar11 * auVar143._8_4_;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar147._12_4_ = (uint)bVar11 * auVar144._12_4_ | (uint)!bVar11 * auVar143._12_4_;
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            auVar147._16_4_ = (uint)bVar11 * auVar144._16_4_ | (uint)!bVar11 * auVar143._16_4_;
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            auVar147._20_4_ = (uint)bVar11 * auVar144._20_4_ | (uint)!bVar11 * auVar143._20_4_;
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            auVar147._24_4_ = (uint)bVar11 * auVar144._24_4_ | (uint)!bVar11 * auVar143._24_4_;
            bVar11 = SUB81(uVar13 >> 7,0);
            auVar147._28_4_ = (uint)bVar11 * auVar144._28_4_ | (uint)!bVar11 * auVar143._28_4_;
            auVar142 = vfmsub231ps_avx512vl(auVar142,auVar147,auVar158);
            auVar142 = vfnmsub231ps_avx512vl(auVar142,auVar147,auVar240);
            auVar245._0_4_ = auVar142._0_4_ * auVar142._0_4_;
            auVar245._4_4_ = auVar142._4_4_ * auVar142._4_4_;
            auVar245._8_4_ = auVar142._8_4_ * auVar142._8_4_;
            auVar245._12_4_ = auVar142._12_4_ * auVar142._12_4_;
            auVar245._16_4_ = auVar142._16_4_ * auVar142._16_4_;
            auVar245._20_4_ = auVar142._20_4_ * auVar142._20_4_;
            auVar245._24_4_ = auVar142._24_4_ * auVar142._24_4_;
            auVar245._28_4_ = 0;
            auVar143 = vfmadd213ps_avx512vl(auVar159,auVar142,auVar223);
            auVar143 = vfmadd213ps_avx512vl(auVar143,auVar142,auVar226);
            auVar143 = vfmadd213ps_avx512vl(auVar143,auVar142,auVar229);
            auVar143 = vfmadd213ps_avx512vl(auVar143,auVar142,auVar232);
            auVar143 = vfmadd213ps_avx512vl(auVar143,auVar142,auVar155);
            auVar142 = vfmadd213ps_avx512vl(auVar143,auVar245,auVar142);
            auVar143 = vaddps_avx512vl(auVar142,auVar157);
            auVar142 = vcvttps2dq_avx512vl(auVar147);
            auVar142 = vpslld_avx2(auVar142,0x17);
            auVar142 = vpaddd_avx2(auVar142,auVar236);
            auVar120 = vfmadd213ps_fma(auVar142,auVar143,auVar157);
            uVar13 = vcmpps_avx512vl(ZEXT1632(auVar120),ZEXT1632(auVar100),2);
            auVar39._8_4_ = 0x800000;
            auVar39._0_8_ = 0x80000000800000;
            auVar39._12_4_ = 0x800000;
            auVar39._16_4_ = 0x800000;
            auVar39._20_4_ = 0x800000;
            auVar39._24_4_ = 0x800000;
            auVar39._28_4_ = 0x800000;
            auVar142 = vmaxps_avx512vl(ZEXT1632(auVar120),auVar39);
            auVar145 = vpsrld_avx2(auVar142,0x17);
            auVar143 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
            auVar40._8_4_ = 0x3f000000;
            auVar40._0_8_ = 0x3f0000003f000000;
            auVar40._12_4_ = 0x3f000000;
            auVar40._16_4_ = 0x3f000000;
            auVar40._20_4_ = 0x3f000000;
            auVar40._24_4_ = 0x3f000000;
            auVar40._28_4_ = 0x3f000000;
            auVar142 = vpternlogd_avx512vl(auVar142,auVar143,auVar40,0xea);
            auVar41._8_4_ = 0x3f3504f3;
            auVar41._0_8_ = 0x3f3504f33f3504f3;
            auVar41._12_4_ = 0x3f3504f3;
            auVar41._16_4_ = 0x3f3504f3;
            auVar41._20_4_ = 0x3f3504f3;
            auVar41._24_4_ = 0x3f3504f3;
            auVar41._28_4_ = 0x3f3504f3;
            uVar14 = vcmpps_avx512vl(auVar142,auVar41,1);
            auVar143 = vaddps_avx512vl(auVar142,auVar136);
            auVar142 = vaddps_avx512vl(auVar143,auVar142);
            bVar11 = (bool)((byte)uVar14 & 1);
            auVar148._0_4_ = (uint)bVar11 * auVar142._0_4_ | (uint)!bVar11 * auVar143._0_4_;
            bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
            auVar148._4_4_ = (uint)bVar11 * auVar142._4_4_ | (uint)!bVar11 * auVar143._4_4_;
            bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
            auVar148._8_4_ = (uint)bVar11 * auVar142._8_4_ | (uint)!bVar11 * auVar143._8_4_;
            bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
            auVar148._12_4_ = (uint)bVar11 * auVar142._12_4_ | (uint)!bVar11 * auVar143._12_4_;
            bVar11 = (bool)((byte)(uVar14 >> 4) & 1);
            auVar148._16_4_ = (uint)bVar11 * auVar142._16_4_ | (uint)!bVar11 * auVar143._16_4_;
            bVar11 = (bool)((byte)(uVar14 >> 5) & 1);
            auVar148._20_4_ = (uint)bVar11 * auVar142._20_4_ | (uint)!bVar11 * auVar143._20_4_;
            bVar11 = (bool)((byte)(uVar14 >> 6) & 1);
            auVar148._24_4_ = (uint)bVar11 * auVar142._24_4_ | (uint)!bVar11 * auVar143._24_4_;
            bVar11 = SUB81(uVar14 >> 7,0);
            auVar148._28_4_ = (uint)bVar11 * auVar142._28_4_ | (uint)!bVar11 * auVar143._28_4_;
            auVar143 = vmulps_avx512vl(auVar148,auVar148);
            auVar142 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
            auVar42._8_4_ = 0xbdebd1b8;
            auVar42._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar42._12_4_ = 0xbdebd1b8;
            auVar42._16_4_ = 0xbdebd1b8;
            auVar42._20_4_ = 0xbdebd1b8;
            auVar42._24_4_ = 0xbdebd1b8;
            auVar42._28_4_ = 0xbdebd1b8;
            auVar142 = vfmadd213ps_avx512vl(auVar142,auVar148,auVar42);
            auVar43._8_4_ = 0x3def251a;
            auVar43._0_8_ = 0x3def251a3def251a;
            auVar43._12_4_ = 0x3def251a;
            auVar43._16_4_ = 0x3def251a;
            auVar43._20_4_ = 0x3def251a;
            auVar43._24_4_ = 0x3def251a;
            auVar43._28_4_ = 0x3def251a;
            auVar142 = vfmadd213ps_avx512vl(auVar142,auVar148,auVar43);
            auVar44._8_4_ = 0xbdfe5d4f;
            auVar44._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar44._12_4_ = 0xbdfe5d4f;
            auVar44._16_4_ = 0xbdfe5d4f;
            auVar44._20_4_ = 0xbdfe5d4f;
            auVar44._24_4_ = 0xbdfe5d4f;
            auVar44._28_4_ = 0xbdfe5d4f;
            auVar142 = vfmadd213ps_avx512vl(auVar142,auVar148,auVar44);
            auVar45._8_4_ = 0x3e11e9bf;
            auVar45._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar45._12_4_ = 0x3e11e9bf;
            auVar45._16_4_ = 0x3e11e9bf;
            auVar45._20_4_ = 0x3e11e9bf;
            auVar45._24_4_ = 0x3e11e9bf;
            auVar45._28_4_ = 0x3e11e9bf;
            auVar142 = vfmadd213ps_avx512vl(auVar142,auVar148,auVar45);
            auVar142 = vfmadd213ps_avx512vl(auVar142,auVar148,auVar137);
            auVar142 = vfmadd213ps_avx512vl(auVar142,auVar148,auVar138);
            auVar142 = vfmadd213ps_avx512vl(auVar142,auVar148,auVar139);
            auVar142 = vfmadd213ps_avx512vl(auVar142,auVar148,auVar140);
            auVar144 = vmulps_avx512vl(auVar143,auVar148);
            in_ZMM18 = ZEXT3264(auVar144);
            auVar144 = vmulps_avx512vl(auVar144,auVar142);
            auVar46._8_4_ = 0xffffff82;
            auVar46._0_8_ = 0xffffff82ffffff82;
            auVar46._12_4_ = 0xffffff82;
            auVar46._16_4_ = 0xffffff82;
            auVar46._20_4_ = 0xffffff82;
            auVar46._24_4_ = 0xffffff82;
            auVar46._28_4_ = 0xffffff82;
            auVar142 = vpaddd_avx512vl(auVar145,auVar46);
            auVar142 = vcvtdq2ps_avx(auVar142);
            auVar145 = vsubps_avx512vl(auVar142,auVar157);
            bVar11 = (bool)((byte)uVar14 & 1);
            auVar149._0_4_ = (uint)bVar11 * auVar145._0_4_ | (uint)!bVar11 * auVar142._0_4_;
            bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
            auVar149._4_4_ = (uint)bVar11 * auVar145._4_4_ | (uint)!bVar11 * auVar142._4_4_;
            bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
            auVar149._8_4_ = (uint)bVar11 * auVar145._8_4_ | (uint)!bVar11 * auVar142._8_4_;
            bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
            auVar149._12_4_ = (uint)bVar11 * auVar145._12_4_ | (uint)!bVar11 * auVar142._12_4_;
            bVar11 = (bool)((byte)(uVar14 >> 4) & 1);
            auVar149._16_4_ = (uint)bVar11 * auVar145._16_4_ | (uint)!bVar11 * auVar142._16_4_;
            bVar11 = (bool)((byte)(uVar14 >> 5) & 1);
            auVar149._20_4_ = (uint)bVar11 * auVar145._20_4_ | (uint)!bVar11 * auVar142._20_4_;
            bVar11 = (bool)((byte)(uVar14 >> 6) & 1);
            auVar149._24_4_ = (uint)bVar11 * auVar145._24_4_ | (uint)!bVar11 * auVar142._24_4_;
            bVar11 = SUB81(uVar14 >> 7,0);
            auVar149._28_4_ = (uint)bVar11 * auVar145._28_4_ | (uint)!bVar11 * auVar142._28_4_;
            auVar142 = vfmadd231ps_avx512vl(auVar144,auVar149,auVar240);
            auVar142 = vfmsub231ps_avx512vl(auVar142,auVar155,auVar143);
            auVar142 = vsubps_avx512vl(auVar142,auVar148);
            auVar120 = vfmsub231ps_fma(auVar142,auVar158,auVar149);
            auVar142 = vmulps_avx512vl(ZEXT1632(auVar120),auVar141);
            auVar143 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar150._0_4_ = (uint)bVar11 * auVar143._0_4_ | (uint)!bVar11 * auVar142._0_4_;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar150._4_4_ = (uint)bVar11 * auVar143._4_4_ | (uint)!bVar11 * auVar142._4_4_;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar150._8_4_ = (uint)bVar11 * auVar143._8_4_ | (uint)!bVar11 * auVar142._8_4_;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar150._12_4_ = (uint)bVar11 * auVar143._12_4_ | (uint)!bVar11 * auVar142._12_4_;
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            auVar150._16_4_ = (uint)bVar11 * auVar143._16_4_ | (uint)!bVar11 * auVar142._16_4_;
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            auVar150._20_4_ = (uint)bVar11 * auVar143._20_4_ | (uint)!bVar11 * auVar142._20_4_;
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            auVar150._24_4_ = (uint)bVar11 * auVar143._24_4_ | (uint)!bVar11 * auVar142._24_4_;
            bVar11 = SUB81(uVar13 >> 7,0);
            auVar150._28_4_ = (uint)bVar11 * auVar143._28_4_ | (uint)!bVar11 * auVar142._28_4_;
            auVar142 = vminps_avx(auVar150,auVar153);
            auVar142 = vmaxps_avx(auVar142,auVar154);
            auVar120 = vfmadd213ps_fma(auVar156,auVar142,auVar155);
            auVar143 = vrndscaleps_avx512vl(ZEXT1632(auVar120),1);
            uVar13 = vcmpps_avx512vl(ZEXT1632(auVar120),auVar143,1);
            auVar144 = vsubps_avx512vl(auVar143,auVar157);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar151._0_4_ = (uint)bVar11 * auVar144._0_4_ | (uint)!bVar11 * auVar143._0_4_;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar151._4_4_ = (uint)bVar11 * auVar144._4_4_ | (uint)!bVar11 * auVar143._4_4_;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar151._8_4_ = (uint)bVar11 * auVar144._8_4_ | (uint)!bVar11 * auVar143._8_4_;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar151._12_4_ = (uint)bVar11 * auVar144._12_4_ | (uint)!bVar11 * auVar143._12_4_;
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            auVar151._16_4_ = (uint)bVar11 * auVar144._16_4_ | (uint)!bVar11 * auVar143._16_4_;
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            auVar151._20_4_ = (uint)bVar11 * auVar144._20_4_ | (uint)!bVar11 * auVar143._20_4_;
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            auVar151._24_4_ = (uint)bVar11 * auVar144._24_4_ | (uint)!bVar11 * auVar143._24_4_;
            bVar11 = SUB81(uVar13 >> 7,0);
            auVar151._28_4_ = (uint)bVar11 * auVar144._28_4_ | (uint)!bVar11 * auVar143._28_4_;
            in_ZMM16 = ZEXT3264(auVar151);
            auVar142 = vfmsub231ps_avx512vl(auVar142,auVar151,auVar158);
            auVar142 = vfnmsub231ps_avx512vl(auVar142,auVar151,auVar240);
            auVar246._0_4_ = auVar142._0_4_ * auVar142._0_4_;
            auVar246._4_4_ = auVar142._4_4_ * auVar142._4_4_;
            auVar246._8_4_ = auVar142._8_4_ * auVar142._8_4_;
            auVar246._12_4_ = auVar142._12_4_ * auVar142._12_4_;
            auVar246._16_4_ = auVar142._16_4_ * auVar142._16_4_;
            auVar246._20_4_ = auVar142._20_4_ * auVar142._20_4_;
            auVar246._24_4_ = auVar142._24_4_ * auVar142._24_4_;
            auVar246._28_4_ = 0;
            auVar143 = vfmadd213ps_avx512vl(auVar159,auVar142,auVar223);
            auVar143 = vfmadd213ps_avx512vl(auVar143,auVar142,auVar226);
            auVar143 = vfmadd213ps_avx512vl(auVar143,auVar142,auVar229);
            auVar143 = vfmadd213ps_avx512vl(auVar143,auVar142,auVar232);
            auVar143 = vfmadd213ps_avx512vl(auVar143,auVar142,auVar155);
            auVar142 = vfmadd213ps_avx512vl(auVar143,auVar246,auVar142);
            in_ZMM17 = ZEXT3264(auVar142);
            auVar143 = vaddps_avx512vl(auVar142,auVar157);
            auVar142 = vcvttps2dq_avx512vl(auVar151);
            auVar142 = vpslld_avx2(auVar142,0x17);
            auVar142 = vpaddd_avx2(auVar142,auVar236);
            auVar120 = vfmadd213ps_fma(auVar142,auVar143,auVar157);
            auVar142 = vrcpps_avx(ZEXT1632(auVar120));
            auVar120 = vfmsub213ps_fma(ZEXT1632(auVar120),auVar142,auVar157);
            auVar120 = vfnmadd132ps_fma(ZEXT1632(auVar120),auVar142,auVar142);
            auVar143 = vfnmadd213ps_avx512vl(ZEXT1632(auVar120),auVar141,auVar136);
            auVar146._4_4_ = auVar143._4_4_ * auVar184._4_4_;
            auVar146._0_4_ = auVar143._0_4_ * auVar184._0_4_;
            auVar146._8_4_ = auVar143._8_4_ * auVar184._8_4_;
            auVar146._12_4_ = auVar143._12_4_ * auVar184._12_4_;
            auVar146._16_4_ = auVar143._16_4_ * auVar184._16_4_;
            auVar146._20_4_ = auVar143._20_4_ * auVar184._20_4_;
            auVar146._24_4_ = auVar143._24_4_ * auVar184._24_4_;
            auVar146._28_4_ = auVar142._28_4_;
            break;
          case 6:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var4);
            auVar218._4_4_ = uVar1;
            auVar218._0_4_ = uVar1;
            auVar218._8_4_ = uVar1;
            auVar218._12_4_ = uVar1;
            auVar218._16_4_ = uVar1;
            auVar218._20_4_ = uVar1;
            auVar218._24_4_ = uVar1;
            auVar218._28_4_ = uVar1;
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var4))[1];
            auVar38._4_4_ = uVar1;
            auVar38._0_4_ = uVar1;
            auVar38._8_4_ = uVar1;
            auVar38._12_4_ = uVar1;
            auVar38._16_4_ = uVar1;
            auVar38._20_4_ = uVar1;
            auVar38._24_4_ = uVar1;
            auVar38._28_4_ = uVar1;
            auVar142 = vfmadd213ps_avx512vl(auVar218,auVar184,auVar38);
            auVar142 = vmaxps_avx512vl(auVar142,ZEXT1632(auVar100));
            auVar142 = vminps_avx(auVar142,auVar157);
            auVar146._4_4_ = auVar142._4_4_ * auVar184._4_4_;
            auVar146._0_4_ = auVar142._0_4_ * auVar184._0_4_;
            auVar146._8_4_ = auVar142._8_4_ * auVar184._8_4_;
            auVar146._12_4_ = auVar142._12_4_ * auVar184._12_4_;
            auVar146._16_4_ = auVar142._16_4_ * auVar184._16_4_;
            auVar146._20_4_ = auVar142._20_4_ * auVar184._20_4_;
            auVar146._24_4_ = auVar142._24_4_ * auVar184._24_4_;
            auVar146._28_4_ = auVar142._28_4_;
          }
        }
        *(undefined1 (*) [32])((long)top_blob->data + uVar83 * 0x20) = auVar146;
      }
    }
    else {
      local_140 = 0;
      if (iVar92 == 0x10) {
        auVar170 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        auVar171 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q2,auVar170);
        auVar172 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q1,auVar170);
        auVar173 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
        local_140 = 0;
        uVar98 = (ulong)uVar3;
        if ((int)uVar3 < 1) {
          uVar98 = 0;
        }
        auVar174 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar170);
        auVar175 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar100 = vxorps_avx512vl(auVar100,auVar100);
        auVar250 = ZEXT1664(auVar100);
        auVar176 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
        for (uVar83 = 0; uVar83 != uVar98; uVar83 = uVar83 + 1) {
          auVar100 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          auVar248 = ZEXT1664(auVar100);
          auVar100 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          auVar247 = ZEXT1664(auVar100);
          if (lVar6 != 0) {
            auVar247 = *(undefined1 (*) [64])(lVar6 + uVar83 * 0x40);
          }
          pauVar85 = (undefined1 (*) [64])
                     ((long)(this->weight_data_tm).w * uVar83 * (this->weight_data_tm).elemsize +
                     (long)(this->weight_data_tm).data);
          lVar89 = 0;
          iVar92 = 0;
          auVar100 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          auVar249 = ZEXT1664(auVar100);
          auVar100 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar100);
          auVar100 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar100);
          auVar100 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
          in_ZMM20 = ZEXT1664(auVar100);
          auVar100 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar100);
          auVar100 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar100);
          pauVar93 = local_c8;
          for (; iVar92 + 7 < iVar88; iVar92 = iVar92 + 8) {
            auVar177 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar93));
            auVar178 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar93 + 4)));
            auVar179 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar93 + 8)));
            auVar180 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar93 + 0xc)));
            auVar247 = vfmadd231ps_avx512f(auVar247,auVar177,*pauVar85);
            in_ZMM23 = vfmadd231ps_avx512f(in_ZMM23,auVar178,pauVar85[1]);
            in_ZMM22 = vfmadd231ps_avx512f(in_ZMM22,auVar179,pauVar85[2]);
            in_ZMM20 = vfmadd231ps_avx512f(in_ZMM20,auVar180,pauVar85[3]);
            auVar177 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar93 + 0x10)));
            auVar178 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar93 + 0x14)));
            auVar179 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar93 + 0x18)));
            auVar180 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar93 + 0x1c)));
            in_ZMM21 = vfmadd231ps_avx512f(in_ZMM21,auVar177,pauVar85[4]);
            in_ZMM19 = vfmadd231ps_avx512f(in_ZMM19,auVar178,pauVar85[5]);
            auVar249 = vfmadd231ps_avx512f(auVar249,auVar179,pauVar85[6]);
            auVar248 = vfmadd231ps_avx512f(auVar248,auVar180,pauVar85[7]);
            pauVar93 = pauVar93 + 1;
            pauVar85 = pauVar85 + 8;
            lVar89 = lVar89 + 8;
          }
          for (; iVar92 + 3 < iVar88; iVar92 = iVar92 + 4) {
            auVar177 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar93));
            auVar178 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar93 + 4)));
            auVar179 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar93 + 8)));
            auVar180 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar93 + 0xc)));
            auVar247 = vfmadd231ps_avx512f(auVar247,auVar177,*pauVar85);
            in_ZMM23 = vfmadd231ps_avx512f(in_ZMM23,auVar178,pauVar85[1]);
            in_ZMM22 = vfmadd231ps_avx512f(in_ZMM22,auVar179,pauVar85[2]);
            in_ZMM20 = vfmadd231ps_avx512f(in_ZMM20,auVar180,pauVar85[3]);
            pauVar93 = (undefined1 (*) [32])(*pauVar93 + 0x10);
            pauVar85 = pauVar85 + 4;
            lVar89 = lVar89 + 4;
          }
          for (; (int)lVar89 < iVar88; lVar89 = lVar89 + 1) {
            auVar177 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*local_c8 + lVar89 * 4)));
            auVar247 = vfmadd231ps_avx512f(auVar247,auVar177,*pauVar85);
            pauVar85 = pauVar85 + 1;
          }
          auVar248 = vaddps_avx512f(auVar249,auVar248);
          auVar249 = vaddps_avx512f(in_ZMM19,in_ZMM21);
          auVar248 = vaddps_avx512f(auVar248,auVar249);
          auVar249 = vaddps_avx512f(in_ZMM20,in_ZMM22);
          in_ZMM18 = vaddps_avx512f(auVar249,in_ZMM23);
          in_ZMM17 = vaddps_avx512f(auVar248,in_ZMM18);
          auVar247 = vaddps_avx512f(in_ZMM17,auVar247);
          in_ZMM16 = auVar247;
          switch(iVar81) {
          case 1:
            in_ZMM16 = vmaxps_avx512f(auVar247,auVar250);
            break;
          case 2:
            uVar13 = vcmpps_avx512f(auVar247,auVar250,1);
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var4);
            auVar65._4_4_ = uVar1;
            auVar65._0_4_ = uVar1;
            auVar65._8_4_ = uVar1;
            auVar65._12_4_ = uVar1;
            auVar65._16_4_ = uVar1;
            auVar65._20_4_ = uVar1;
            auVar65._24_4_ = uVar1;
            auVar65._28_4_ = uVar1;
            auVar65._32_4_ = uVar1;
            auVar65._36_4_ = uVar1;
            auVar65._40_4_ = uVar1;
            auVar65._44_4_ = uVar1;
            auVar65._48_4_ = uVar1;
            auVar65._52_4_ = uVar1;
            auVar65._56_4_ = uVar1;
            auVar65._60_4_ = uVar1;
            auVar248 = vmulps_avx512f(auVar247,auVar65);
            bVar11 = (bool)((byte)uVar13 & 1);
            in_ZMM16._0_4_ = (uint)bVar11 * auVar248._0_4_ | (uint)!bVar11 * auVar247._0_4_;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            in_ZMM16._4_4_ = (uint)bVar11 * auVar248._4_4_ | (uint)!bVar11 * auVar247._4_4_;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            in_ZMM16._8_4_ = (uint)bVar11 * auVar248._8_4_ | (uint)!bVar11 * auVar247._8_4_;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            in_ZMM16._12_4_ = (uint)bVar11 * auVar248._12_4_ | (uint)!bVar11 * auVar247._12_4_;
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            in_ZMM16._16_4_ = (uint)bVar11 * auVar248._16_4_ | (uint)!bVar11 * auVar247._16_4_;
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            in_ZMM16._20_4_ = (uint)bVar11 * auVar248._20_4_ | (uint)!bVar11 * auVar247._20_4_;
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            in_ZMM16._24_4_ = (uint)bVar11 * auVar248._24_4_ | (uint)!bVar11 * auVar247._24_4_;
            bVar11 = (bool)((byte)(uVar13 >> 7) & 1);
            in_ZMM16._28_4_ = (uint)bVar11 * auVar248._28_4_ | (uint)!bVar11 * auVar247._28_4_;
            bVar11 = (bool)((byte)(uVar13 >> 8) & 1);
            in_ZMM16._32_4_ = (uint)bVar11 * auVar248._32_4_ | (uint)!bVar11 * auVar247._32_4_;
            bVar11 = (bool)((byte)(uVar13 >> 9) & 1);
            in_ZMM16._36_4_ = (uint)bVar11 * auVar248._36_4_ | (uint)!bVar11 * auVar247._36_4_;
            bVar11 = (bool)((byte)(uVar13 >> 10) & 1);
            in_ZMM16._40_4_ = (uint)bVar11 * auVar248._40_4_ | (uint)!bVar11 * auVar247._40_4_;
            bVar11 = (bool)((byte)(uVar13 >> 0xb) & 1);
            in_ZMM16._44_4_ = (uint)bVar11 * auVar248._44_4_ | (uint)!bVar11 * auVar247._44_4_;
            bVar11 = (bool)((byte)(uVar13 >> 0xc) & 1);
            in_ZMM16._48_4_ = (uint)bVar11 * auVar248._48_4_ | (uint)!bVar11 * auVar247._48_4_;
            bVar11 = (bool)((byte)(uVar13 >> 0xd) & 1);
            in_ZMM16._52_4_ = (uint)bVar11 * auVar248._52_4_ | (uint)!bVar11 * auVar247._52_4_;
            bVar11 = (bool)((byte)(uVar13 >> 0xe) & 1);
            in_ZMM16._56_4_ = (uint)bVar11 * auVar248._56_4_ | (uint)!bVar11 * auVar247._56_4_;
            bVar11 = SUB81(uVar13 >> 0xf,0);
            in_ZMM16._60_4_ = (uint)bVar11 * auVar248._60_4_ | (uint)!bVar11 * auVar247._60_4_;
            break;
          case 3:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var4);
            auVar177._4_4_ = uVar1;
            auVar177._0_4_ = uVar1;
            auVar177._8_4_ = uVar1;
            auVar177._12_4_ = uVar1;
            auVar177._16_4_ = uVar1;
            auVar177._20_4_ = uVar1;
            auVar177._24_4_ = uVar1;
            auVar177._28_4_ = uVar1;
            auVar177._32_4_ = uVar1;
            auVar177._36_4_ = uVar1;
            auVar177._40_4_ = uVar1;
            auVar177._44_4_ = uVar1;
            auVar177._48_4_ = uVar1;
            auVar177._52_4_ = uVar1;
            auVar177._56_4_ = uVar1;
            auVar177._60_4_ = uVar1;
            auVar248 = vmaxps_avx512f(auVar247,auVar177);
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var4))[1];
            auVar247._4_4_ = uVar1;
            auVar247._0_4_ = uVar1;
            auVar247._8_4_ = uVar1;
            auVar247._12_4_ = uVar1;
            auVar247._16_4_ = uVar1;
            auVar247._20_4_ = uVar1;
            auVar247._24_4_ = uVar1;
            auVar247._28_4_ = uVar1;
            auVar247._32_4_ = uVar1;
            auVar247._36_4_ = uVar1;
            auVar247._40_4_ = uVar1;
            auVar247._44_4_ = uVar1;
            auVar247._48_4_ = uVar1;
            auVar247._52_4_ = uVar1;
            auVar247._56_4_ = uVar1;
            auVar247._60_4_ = uVar1;
            in_ZMM16 = vminps_avx512f(auVar248,auVar247);
            break;
          case 4:
            auVar247 = vxorps_avx512dq(auVar247,auVar170);
            auVar247 = vminps_avx512f(auVar247,(undefined1  [64])afVar70);
            auVar247 = vmaxps_avx512f(auVar247,(undefined1  [64])afVar71);
            auVar248 = vfmadd213ps_avx512f((undefined1  [64])afVar72,auVar247,
                                           (undefined1  [64])afVar78);
            auVar249 = vrndscaleps_avx512f(auVar248,1);
            uVar13 = vcmpps_avx512f(auVar248,auVar249,1);
            auVar248 = vsubps_avx512f(auVar249,(undefined1  [64])afVar69);
            bVar11 = (bool)((byte)uVar13 & 1);
            in_ZMM18._0_4_ = (uint)bVar11 * auVar248._0_4_ | (uint)!bVar11 * auVar249._0_4_;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            in_ZMM18._4_4_ = (uint)bVar11 * auVar248._4_4_ | (uint)!bVar11 * auVar249._4_4_;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            in_ZMM18._8_4_ = (uint)bVar11 * auVar248._8_4_ | (uint)!bVar11 * auVar249._8_4_;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            in_ZMM18._12_4_ = (uint)bVar11 * auVar248._12_4_ | (uint)!bVar11 * auVar249._12_4_;
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            in_ZMM18._16_4_ = (uint)bVar11 * auVar248._16_4_ | (uint)!bVar11 * auVar249._16_4_;
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            in_ZMM18._20_4_ = (uint)bVar11 * auVar248._20_4_ | (uint)!bVar11 * auVar249._20_4_;
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            in_ZMM18._24_4_ = (uint)bVar11 * auVar248._24_4_ | (uint)!bVar11 * auVar249._24_4_;
            bVar11 = (bool)((byte)(uVar13 >> 7) & 1);
            in_ZMM18._28_4_ = (uint)bVar11 * auVar248._28_4_ | (uint)!bVar11 * auVar249._28_4_;
            bVar11 = (bool)((byte)(uVar13 >> 8) & 1);
            in_ZMM18._32_4_ = (uint)bVar11 * auVar248._32_4_ | (uint)!bVar11 * auVar249._32_4_;
            bVar11 = (bool)((byte)(uVar13 >> 9) & 1);
            in_ZMM18._36_4_ = (uint)bVar11 * auVar248._36_4_ | (uint)!bVar11 * auVar249._36_4_;
            bVar11 = (bool)((byte)(uVar13 >> 10) & 1);
            in_ZMM18._40_4_ = (uint)bVar11 * auVar248._40_4_ | (uint)!bVar11 * auVar249._40_4_;
            bVar11 = (bool)((byte)(uVar13 >> 0xb) & 1);
            in_ZMM18._44_4_ = (uint)bVar11 * auVar248._44_4_ | (uint)!bVar11 * auVar249._44_4_;
            bVar11 = (bool)((byte)(uVar13 >> 0xc) & 1);
            in_ZMM18._48_4_ = (uint)bVar11 * auVar248._48_4_ | (uint)!bVar11 * auVar249._48_4_;
            bVar11 = (bool)((byte)(uVar13 >> 0xd) & 1);
            in_ZMM18._52_4_ = (uint)bVar11 * auVar248._52_4_ | (uint)!bVar11 * auVar249._52_4_;
            bVar11 = (bool)((byte)(uVar13 >> 0xe) & 1);
            in_ZMM18._56_4_ = (uint)bVar11 * auVar248._56_4_ | (uint)!bVar11 * auVar249._56_4_;
            bVar11 = SUB81(uVar13 >> 0xf,0);
            in_ZMM18._60_4_ = (uint)bVar11 * auVar248._60_4_ | (uint)!bVar11 * auVar249._60_4_;
            auVar247 = vfmadd231ps_avx512f(auVar247,in_ZMM18,auVar171);
            auVar247 = vfmadd231ps_avx512f(auVar247,in_ZMM18,auVar172);
            auVar248 = vmulps_avx512f(auVar247,auVar247);
            auVar249 = vfmadd213ps_avx512f(auVar247,(undefined1  [64])afVar73,
                                           (undefined1  [64])afVar74);
            auVar249 = vfmadd213ps_avx512f(auVar249,auVar247,(undefined1  [64])afVar75);
            auVar249 = vfmadd213ps_avx512f(auVar249,auVar247,(undefined1  [64])afVar76);
            auVar249 = vfmadd213ps_avx512f(auVar249,auVar247,(undefined1  [64])afVar77);
            auVar249 = vfmadd213ps_avx512f(auVar249,auVar247,(undefined1  [64])afVar78);
            in_ZMM19 = vfmadd213ps_avx512f(auVar249,auVar248,auVar247);
            auVar247 = vaddps_avx512f(in_ZMM19,(undefined1  [64])afVar69);
            auVar248 = vcvttps2dq_avx512f(in_ZMM18);
            auVar248 = vpaddd_avx512f(auVar248,auVar173);
            auVar248 = vpslld_avx512f(auVar248,0x17);
            auVar247 = vfmadd213ps_avx512f(auVar248,auVar247,auVar175);
            in_ZMM17 = vrcp14ps_avx512f(auVar247);
            auVar247 = vfmsub213ps_avx512f(auVar247,in_ZMM17,auVar175);
            in_ZMM16 = vfnmadd132ps_avx512vl(auVar247,in_ZMM17,in_ZMM17);
            break;
          case 5:
            auVar248 = vminps_avx512f(auVar247,(undefined1  [64])afVar70);
            auVar248 = vmaxps_avx512f(auVar248,(undefined1  [64])afVar71);
            auVar249 = vfmadd213ps_avx512f((undefined1  [64])afVar72,auVar248,
                                           (undefined1  [64])afVar78);
            auVar177 = vrndscaleps_avx512f(auVar249,1);
            uVar13 = vcmpps_avx512f(auVar249,auVar177,1);
            auVar249 = vsubps_avx512f(auVar177,(undefined1  [64])afVar69);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar178._0_4_ = (uint)bVar11 * auVar249._0_4_ | (uint)!bVar11 * auVar177._0_4_;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar178._4_4_ = (uint)bVar11 * auVar249._4_4_ | (uint)!bVar11 * auVar177._4_4_;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar178._8_4_ = (uint)bVar11 * auVar249._8_4_ | (uint)!bVar11 * auVar177._8_4_;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar178._12_4_ = (uint)bVar11 * auVar249._12_4_ | (uint)!bVar11 * auVar177._12_4_;
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            auVar178._16_4_ = (uint)bVar11 * auVar249._16_4_ | (uint)!bVar11 * auVar177._16_4_;
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            auVar178._20_4_ = (uint)bVar11 * auVar249._20_4_ | (uint)!bVar11 * auVar177._20_4_;
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            auVar178._24_4_ = (uint)bVar11 * auVar249._24_4_ | (uint)!bVar11 * auVar177._24_4_;
            bVar11 = (bool)((byte)(uVar13 >> 7) & 1);
            auVar178._28_4_ = (uint)bVar11 * auVar249._28_4_ | (uint)!bVar11 * auVar177._28_4_;
            bVar11 = (bool)((byte)(uVar13 >> 8) & 1);
            auVar178._32_4_ = (uint)bVar11 * auVar249._32_4_ | (uint)!bVar11 * auVar177._32_4_;
            bVar11 = (bool)((byte)(uVar13 >> 9) & 1);
            auVar178._36_4_ = (uint)bVar11 * auVar249._36_4_ | (uint)!bVar11 * auVar177._36_4_;
            bVar11 = (bool)((byte)(uVar13 >> 10) & 1);
            auVar178._40_4_ = (uint)bVar11 * auVar249._40_4_ | (uint)!bVar11 * auVar177._40_4_;
            bVar11 = (bool)((byte)(uVar13 >> 0xb) & 1);
            auVar178._44_4_ = (uint)bVar11 * auVar249._44_4_ | (uint)!bVar11 * auVar177._44_4_;
            bVar11 = (bool)((byte)(uVar13 >> 0xc) & 1);
            auVar178._48_4_ = (uint)bVar11 * auVar249._48_4_ | (uint)!bVar11 * auVar177._48_4_;
            bVar11 = (bool)((byte)(uVar13 >> 0xd) & 1);
            auVar178._52_4_ = (uint)bVar11 * auVar249._52_4_ | (uint)!bVar11 * auVar177._52_4_;
            bVar11 = (bool)((byte)(uVar13 >> 0xe) & 1);
            auVar178._56_4_ = (uint)bVar11 * auVar249._56_4_ | (uint)!bVar11 * auVar177._56_4_;
            bVar11 = SUB81(uVar13 >> 0xf,0);
            auVar178._60_4_ = (uint)bVar11 * auVar249._60_4_ | (uint)!bVar11 * auVar177._60_4_;
            auVar248 = vfmadd231ps_avx512f(auVar248,auVar178,auVar171);
            auVar248 = vfmadd231ps_avx512f(auVar248,auVar178,auVar172);
            auVar249 = vmulps_avx512f(auVar248,auVar248);
            auVar177 = vfmadd213ps_avx512f(auVar248,(undefined1  [64])afVar73,
                                           (undefined1  [64])afVar74);
            auVar177 = vfmadd213ps_avx512f(auVar177,auVar248,(undefined1  [64])afVar75);
            auVar177 = vfmadd213ps_avx512f(auVar177,auVar248,(undefined1  [64])afVar76);
            auVar177 = vfmadd213ps_avx512f(auVar177,auVar248,(undefined1  [64])afVar77);
            auVar177 = vfmadd213ps_avx512f(auVar177,auVar248,(undefined1  [64])afVar78);
            auVar248 = vfmadd213ps_avx512f(auVar177,auVar249,auVar248);
            auVar248 = vaddps_avx512f(auVar248,(undefined1  [64])afVar69);
            auVar249 = vcvttps2dq_avx512f(auVar178);
            auVar249 = vpaddd_avx512f(auVar249,auVar173);
            auVar249 = vpslld_avx512f(auVar249,0x17);
            auVar248 = vfmadd213ps_avx512f(auVar249,auVar248,auVar175);
            auVar249 = vmaxps_avx512f(auVar248,(undefined1  [64])_ps512_min_norm_pos);
            auVar177 = vpsrld_avx512f(auVar249,0x17);
            auVar249 = vpternlogd_avx512f(auVar249,(undefined1  [64])afVar78,
                                          (undefined1  [64])_ps512_inv_mant_mask,0xec);
            uVar13 = vcmpps_avx512f(auVar249,(undefined1  [64])_ps512_cephes_SQRTHF,1);
            auVar178 = vsubps_avx512f(auVar249,(undefined1  [64])afVar69);
            auVar249 = vaddps_avx512f(auVar178,auVar249);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar179._0_4_ = (uint)bVar11 * auVar249._0_4_ | (uint)!bVar11 * auVar178._0_4_;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar179._4_4_ = (uint)bVar11 * auVar249._4_4_ | (uint)!bVar11 * auVar178._4_4_;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar179._8_4_ = (uint)bVar11 * auVar249._8_4_ | (uint)!bVar11 * auVar178._8_4_;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar179._12_4_ = (uint)bVar11 * auVar249._12_4_ | (uint)!bVar11 * auVar178._12_4_;
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            auVar179._16_4_ = (uint)bVar11 * auVar249._16_4_ | (uint)!bVar11 * auVar178._16_4_;
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            auVar179._20_4_ = (uint)bVar11 * auVar249._20_4_ | (uint)!bVar11 * auVar178._20_4_;
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            auVar179._24_4_ = (uint)bVar11 * auVar249._24_4_ | (uint)!bVar11 * auVar178._24_4_;
            bVar11 = (bool)((byte)(uVar13 >> 7) & 1);
            auVar179._28_4_ = (uint)bVar11 * auVar249._28_4_ | (uint)!bVar11 * auVar178._28_4_;
            bVar12 = (byte)(uVar13 >> 8);
            bVar11 = (bool)(bVar12 & 1);
            auVar179._32_4_ = (uint)bVar11 * auVar249._32_4_ | (uint)!bVar11 * auVar178._32_4_;
            bVar11 = (bool)((byte)(uVar13 >> 9) & 1);
            auVar179._36_4_ = (uint)bVar11 * auVar249._36_4_ | (uint)!bVar11 * auVar178._36_4_;
            bVar11 = (bool)((byte)(uVar13 >> 10) & 1);
            auVar179._40_4_ = (uint)bVar11 * auVar249._40_4_ | (uint)!bVar11 * auVar178._40_4_;
            bVar11 = (bool)((byte)(uVar13 >> 0xb) & 1);
            auVar179._44_4_ = (uint)bVar11 * auVar249._44_4_ | (uint)!bVar11 * auVar178._44_4_;
            bVar11 = (bool)((byte)(uVar13 >> 0xc) & 1);
            auVar179._48_4_ = (uint)bVar11 * auVar249._48_4_ | (uint)!bVar11 * auVar178._48_4_;
            bVar11 = (bool)((byte)(uVar13 >> 0xd) & 1);
            auVar179._52_4_ = (uint)bVar11 * auVar249._52_4_ | (uint)!bVar11 * auVar178._52_4_;
            bVar11 = (bool)((byte)(uVar13 >> 0xe) & 1);
            auVar179._56_4_ = (uint)bVar11 * auVar249._56_4_ | (uint)!bVar11 * auVar178._56_4_;
            bVar11 = SUB81(uVar13 >> 0xf,0);
            auVar179._60_4_ = (uint)bVar11 * auVar249._60_4_ | (uint)!bVar11 * auVar178._60_4_;
            auVar249 = vmulps_avx512f(auVar179,auVar179);
            auVar178 = vfmadd132ps_avx512f(auVar179,(undefined1  [64])_ps512_cephes_log_p1,
                                           (undefined1  [64])_ps512_cephes_log_p0);
            auVar178 = vfmadd213ps_avx512f(auVar178,auVar179,(undefined1  [64])_ps512_cephes_log_p2)
            ;
            auVar178 = vfmadd213ps_avx512f(auVar178,auVar179,(undefined1  [64])_ps512_cephes_log_p3)
            ;
            auVar178 = vfmadd213ps_avx512f(auVar178,auVar179,(undefined1  [64])_ps512_cephes_log_p4)
            ;
            auVar178 = vfmadd213ps_avx512f(auVar178,auVar179,(undefined1  [64])_ps512_cephes_log_p5)
            ;
            auVar178 = vfmadd213ps_avx512f(auVar178,auVar179,(undefined1  [64])_ps512_cephes_log_p6)
            ;
            auVar178 = vfmadd213ps_avx512f(auVar178,auVar179,(undefined1  [64])_ps512_cephes_log_p7)
            ;
            in_ZMM21 = vfmadd213ps_avx512f(auVar178,auVar179,(undefined1  [64])_ps512_cephes_log_p8)
            ;
            auVar178 = vmulps_avx512f(auVar249,auVar179);
            auVar178 = vfmadd213ps_avx512f(auVar178,in_ZMM21,auVar179);
            uVar14 = vcmpps_avx512f(auVar248,auVar250,2);
            auVar248 = vpsubd_avx512f(auVar177,auVar173);
            auVar248 = vcvtdq2ps_avx512f(auVar248);
            auVar177 = vaddps_avx512f(auVar248,(undefined1  [64])afVar69);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar180._0_4_ = (uint)bVar11 * auVar248._0_4_ | (uint)!bVar11 * auVar177._0_4_;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar180._4_4_ = (uint)bVar11 * auVar248._4_4_ | (uint)!bVar11 * auVar177._4_4_;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar180._8_4_ = (uint)bVar11 * auVar248._8_4_ | (uint)!bVar11 * auVar177._8_4_;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar180._12_4_ = (uint)bVar11 * auVar248._12_4_ | (uint)!bVar11 * auVar177._12_4_;
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            auVar180._16_4_ = (uint)bVar11 * auVar248._16_4_ | (uint)!bVar11 * auVar177._16_4_;
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            auVar180._20_4_ = (uint)bVar11 * auVar248._20_4_ | (uint)!bVar11 * auVar177._20_4_;
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            auVar180._24_4_ = (uint)bVar11 * auVar248._24_4_ | (uint)!bVar11 * auVar177._24_4_;
            bVar11 = (bool)((byte)(uVar13 >> 7) & 1);
            auVar180._28_4_ = (uint)bVar11 * auVar248._28_4_ | (uint)!bVar11 * auVar177._28_4_;
            bVar11 = (bool)(bVar12 & 1);
            auVar180._32_4_ = (uint)bVar11 * auVar248._32_4_ | (uint)!bVar11 * auVar177._32_4_;
            bVar11 = (bool)((byte)(uVar13 >> 9) & 1);
            auVar180._36_4_ = (uint)bVar11 * auVar248._36_4_ | (uint)!bVar11 * auVar177._36_4_;
            bVar11 = (bool)((byte)(uVar13 >> 10) & 1);
            auVar180._40_4_ = (uint)bVar11 * auVar248._40_4_ | (uint)!bVar11 * auVar177._40_4_;
            bVar11 = (bool)((byte)(uVar13 >> 0xb) & 1);
            auVar180._44_4_ = (uint)bVar11 * auVar248._44_4_ | (uint)!bVar11 * auVar177._44_4_;
            bVar11 = (bool)((byte)(uVar13 >> 0xc) & 1);
            auVar180._48_4_ = (uint)bVar11 * auVar248._48_4_ | (uint)!bVar11 * auVar177._48_4_;
            bVar11 = (bool)((byte)(uVar13 >> 0xd) & 1);
            auVar180._52_4_ = (uint)bVar11 * auVar248._52_4_ | (uint)!bVar11 * auVar177._52_4_;
            bVar11 = (bool)((byte)(uVar13 >> 0xe) & 1);
            auVar180._56_4_ = (uint)bVar11 * auVar248._56_4_ | (uint)!bVar11 * auVar177._56_4_;
            bVar11 = SUB81(uVar13 >> 0xf,0);
            auVar180._60_4_ = (uint)bVar11 * auVar248._60_4_ | (uint)!bVar11 * auVar177._60_4_;
            auVar248 = vfmadd231ps_avx512f(auVar178,auVar180,(undefined1  [64])afVar79);
            auVar248 = vfmadd231ps_avx512f(auVar248,auVar174,auVar249);
            in_ZMM22 = vfmadd231ps_avx512f(auVar248,(undefined1  [64])afVar80,auVar180);
            auVar248 = vmulps_avx512f(in_ZMM22,auVar176);
            auVar177 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
            bVar11 = (bool)((byte)uVar14 & 1);
            auVar249._0_4_ = (uint)bVar11 * auVar177._0_4_ | (uint)!bVar11 * auVar248._0_4_;
            bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
            auVar249._4_4_ = (uint)bVar11 * auVar177._4_4_ | (uint)!bVar11 * auVar248._4_4_;
            bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
            auVar249._8_4_ = (uint)bVar11 * auVar177._8_4_ | (uint)!bVar11 * auVar248._8_4_;
            bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
            auVar249._12_4_ = (uint)bVar11 * auVar177._12_4_ | (uint)!bVar11 * auVar248._12_4_;
            bVar11 = (bool)((byte)(uVar14 >> 4) & 1);
            auVar249._16_4_ = (uint)bVar11 * auVar177._16_4_ | (uint)!bVar11 * auVar248._16_4_;
            bVar11 = (bool)((byte)(uVar14 >> 5) & 1);
            auVar249._20_4_ = (uint)bVar11 * auVar177._20_4_ | (uint)!bVar11 * auVar248._20_4_;
            bVar11 = (bool)((byte)(uVar14 >> 6) & 1);
            auVar249._24_4_ = (uint)bVar11 * auVar177._24_4_ | (uint)!bVar11 * auVar248._24_4_;
            bVar11 = (bool)((byte)(uVar14 >> 7) & 1);
            auVar249._28_4_ = (uint)bVar11 * auVar177._28_4_ | (uint)!bVar11 * auVar248._28_4_;
            bVar11 = (bool)((byte)(uVar14 >> 8) & 1);
            auVar249._32_4_ = (uint)bVar11 * auVar177._32_4_ | (uint)!bVar11 * auVar248._32_4_;
            bVar11 = (bool)((byte)(uVar14 >> 9) & 1);
            auVar249._36_4_ = (uint)bVar11 * auVar177._36_4_ | (uint)!bVar11 * auVar248._36_4_;
            bVar11 = (bool)((byte)(uVar14 >> 10) & 1);
            auVar249._40_4_ = (uint)bVar11 * auVar177._40_4_ | (uint)!bVar11 * auVar248._40_4_;
            bVar11 = (bool)((byte)(uVar14 >> 0xb) & 1);
            auVar249._44_4_ = (uint)bVar11 * auVar177._44_4_ | (uint)!bVar11 * auVar248._44_4_;
            bVar11 = (bool)((byte)(uVar14 >> 0xc) & 1);
            auVar249._48_4_ = (uint)bVar11 * auVar177._48_4_ | (uint)!bVar11 * auVar248._48_4_;
            bVar11 = (bool)((byte)(uVar14 >> 0xd) & 1);
            auVar249._52_4_ = (uint)bVar11 * auVar177._52_4_ | (uint)!bVar11 * auVar248._52_4_;
            bVar11 = (bool)((byte)(uVar14 >> 0xe) & 1);
            auVar249._56_4_ = (uint)bVar11 * auVar177._56_4_ | (uint)!bVar11 * auVar248._56_4_;
            bVar11 = SUB81(uVar14 >> 0xf,0);
            auVar249._60_4_ = (uint)bVar11 * auVar177._60_4_ | (uint)!bVar11 * auVar248._60_4_;
            auVar248 = vminps_avx512f(auVar249,(undefined1  [64])afVar70);
            auVar248 = vmaxps_avx512f(auVar248,(undefined1  [64])afVar71);
            auVar249 = vfmadd213ps_avx512f((undefined1  [64])afVar72,auVar248,
                                           (undefined1  [64])afVar78);
            auVar177 = vrndscaleps_avx512f(auVar249,1);
            uVar13 = vcmpps_avx512f(auVar249,auVar177,1);
            auVar249 = vsubps_avx512f(auVar177,(undefined1  [64])afVar69);
            bVar11 = (bool)((byte)uVar13 & 1);
            in_ZMM19._0_4_ = (uint)bVar11 * auVar249._0_4_ | (uint)!bVar11 * auVar177._0_4_;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            in_ZMM19._4_4_ = (uint)bVar11 * auVar249._4_4_ | (uint)!bVar11 * auVar177._4_4_;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            in_ZMM19._8_4_ = (uint)bVar11 * auVar249._8_4_ | (uint)!bVar11 * auVar177._8_4_;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            in_ZMM19._12_4_ = (uint)bVar11 * auVar249._12_4_ | (uint)!bVar11 * auVar177._12_4_;
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            in_ZMM19._16_4_ = (uint)bVar11 * auVar249._16_4_ | (uint)!bVar11 * auVar177._16_4_;
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            in_ZMM19._20_4_ = (uint)bVar11 * auVar249._20_4_ | (uint)!bVar11 * auVar177._20_4_;
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            in_ZMM19._24_4_ = (uint)bVar11 * auVar249._24_4_ | (uint)!bVar11 * auVar177._24_4_;
            bVar11 = (bool)((byte)(uVar13 >> 7) & 1);
            in_ZMM19._28_4_ = (uint)bVar11 * auVar249._28_4_ | (uint)!bVar11 * auVar177._28_4_;
            bVar11 = (bool)((byte)(uVar13 >> 8) & 1);
            in_ZMM19._32_4_ = (uint)bVar11 * auVar249._32_4_ | (uint)!bVar11 * auVar177._32_4_;
            bVar11 = (bool)((byte)(uVar13 >> 9) & 1);
            in_ZMM19._36_4_ = (uint)bVar11 * auVar249._36_4_ | (uint)!bVar11 * auVar177._36_4_;
            bVar11 = (bool)((byte)(uVar13 >> 10) & 1);
            in_ZMM19._40_4_ = (uint)bVar11 * auVar249._40_4_ | (uint)!bVar11 * auVar177._40_4_;
            bVar11 = (bool)((byte)(uVar13 >> 0xb) & 1);
            in_ZMM19._44_4_ = (uint)bVar11 * auVar249._44_4_ | (uint)!bVar11 * auVar177._44_4_;
            bVar11 = (bool)((byte)(uVar13 >> 0xc) & 1);
            in_ZMM19._48_4_ = (uint)bVar11 * auVar249._48_4_ | (uint)!bVar11 * auVar177._48_4_;
            bVar11 = (bool)((byte)(uVar13 >> 0xd) & 1);
            in_ZMM19._52_4_ = (uint)bVar11 * auVar249._52_4_ | (uint)!bVar11 * auVar177._52_4_;
            bVar11 = (bool)((byte)(uVar13 >> 0xe) & 1);
            in_ZMM19._56_4_ = (uint)bVar11 * auVar249._56_4_ | (uint)!bVar11 * auVar177._56_4_;
            bVar11 = SUB81(uVar13 >> 0xf,0);
            in_ZMM19._60_4_ = (uint)bVar11 * auVar249._60_4_ | (uint)!bVar11 * auVar177._60_4_;
            auVar248 = vfmadd231ps_avx512f(auVar248,in_ZMM19,auVar171);
            auVar248 = vfmadd231ps_avx512f(auVar248,in_ZMM19,auVar172);
            auVar249 = vmulps_avx512f(auVar248,auVar248);
            auVar177 = vfmadd213ps_avx512f(auVar248,(undefined1  [64])afVar73,
                                           (undefined1  [64])afVar74);
            auVar177 = vfmadd213ps_avx512f(auVar177,auVar248,(undefined1  [64])afVar75);
            auVar177 = vfmadd213ps_avx512f(auVar177,auVar248,(undefined1  [64])afVar76);
            auVar177 = vfmadd213ps_avx512f(auVar177,auVar248,(undefined1  [64])afVar77);
            auVar177 = vfmadd213ps_avx512f(auVar177,auVar248,(undefined1  [64])afVar78);
            in_ZMM20 = vfmadd213ps_avx512f(auVar177,auVar249,auVar248);
            auVar248 = vaddps_avx512f(in_ZMM20,(undefined1  [64])afVar69);
            auVar249 = vcvttps2dq_avx512f(in_ZMM19);
            auVar249 = vpaddd_avx512f(auVar249,auVar173);
            auVar249 = vpslld_avx512f(auVar249,0x17);
            auVar248 = vfmadd213ps_avx512f(auVar249,auVar248,auVar175);
            in_ZMM17 = vrcp14ps_avx512f(auVar248);
            auVar248 = vfmsub213ps_avx512f(auVar248,in_ZMM17,auVar175);
            auVar248 = vfnmadd132ps_avx512vl(auVar248,in_ZMM17,in_ZMM17);
            in_ZMM18 = vfnmsub213ps_avx512f(auVar248,auVar176,auVar175);
            in_ZMM16 = vmulps_avx512f(in_ZMM18,auVar247);
            break;
          case 6:
            auVar249 = vbroadcastss_avx512f(ZEXT416(**(uint **)(&this->field_0xe8 + (long)p_Var4)));
            uVar3 = (*(uint **)(&this->field_0xe8 + (long)p_Var4))[1];
            auVar248._4_4_ = uVar3;
            auVar248._0_4_ = uVar3;
            auVar248._8_4_ = uVar3;
            auVar248._12_4_ = uVar3;
            auVar248._16_4_ = uVar3;
            auVar248._20_4_ = uVar3;
            auVar248._24_4_ = uVar3;
            auVar248._28_4_ = uVar3;
            auVar248._32_4_ = uVar3;
            auVar248._36_4_ = uVar3;
            auVar248._40_4_ = uVar3;
            auVar248._44_4_ = uVar3;
            auVar248._48_4_ = uVar3;
            auVar248._52_4_ = uVar3;
            auVar248._56_4_ = uVar3;
            auVar248._60_4_ = uVar3;
            auVar248 = vfmadd213ps_avx512f(auVar249,auVar247,auVar248);
            auVar248 = vmaxps_avx512f(auVar248,auVar250);
            in_ZMM17 = vminps_avx512f(auVar248,auVar175);
            in_ZMM16 = vmulps_avx512f(in_ZMM17,auVar247);
          }
          *(undefined1 (*) [64])((long)top_blob->data + uVar83 * 0x40) = in_ZMM16;
        }
      }
    }
  }
  if (piStack_c0 != (int *)0x0) {
    LOCK();
    *piStack_c0 = *piStack_c0 + -1;
    UNLOCK();
    if (*piStack_c0 == 0) {
      if (local_a8 == (Allocator *)0x0) {
        free(local_c8);
      }
      else {
        (*local_a8->_vptr_Allocator[3])();
      }
    }
  }
  return local_140;
}

Assistant:

int InnerProduct_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return forward_fp16s(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}